

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  RayK<4> *pRVar63;
  byte bVar64;
  ulong uVar65;
  bool bVar66;
  ulong uVar67;
  uint uVar68;
  Geometry *geometry;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  float fVar72;
  float fVar124;
  float fVar126;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar83 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar73;
  undefined1 auVar84 [16];
  float fVar125;
  float fVar127;
  float fVar129;
  float fVar130;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar128;
  float fVar131;
  float fVar132;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined4 uVar133;
  vint4 bi_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined8 uVar141;
  vint4 bi_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  float fVar148;
  float fVar159;
  vint4 ai_2;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  float fVar160;
  float fVar167;
  float fVar168;
  vint4 bi;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar169;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vint4 ai;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [64];
  vint4 ai_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [64];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_6f9;
  undefined8 local_680;
  undefined8 uStack_678;
  ulong local_668;
  RTCFilterFunctionNArguments local_660;
  undefined1 local_630 [16];
  undefined8 local_620;
  undefined8 uStack_618;
  undefined4 local_610;
  undefined4 uStack_60c;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  LinearSpace3fa *local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined1 local_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  byte local_310;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  uint local_280;
  uint uStack_27c;
  uint uStack_278;
  uint uStack_274;
  uint uStack_270;
  uint uStack_26c;
  uint uStack_268;
  uint uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar71 = (ulong)(byte)PVar8;
  fVar160 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar81 = vsubps_avx(auVar81,*(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  auVar149._0_4_ = fVar160 * auVar81._0_4_;
  auVar149._4_4_ = fVar160 * auVar81._4_4_;
  auVar149._8_4_ = fVar160 * auVar81._8_4_;
  auVar149._12_4_ = fVar160 * auVar81._12_4_;
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar84._0_4_ = fVar160 * auVar79._0_4_;
  auVar84._4_4_ = fVar160 * auVar79._4_4_;
  auVar84._8_4_ = fVar160 * auVar79._8_4_;
  auVar84._12_4_ = fVar160 * auVar79._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar71 + 6)));
  uVar70 = (ulong)(uint)((int)(uVar71 * 9) * 2);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 + uVar71 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar67 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar187._4_4_ = auVar84._0_4_;
  auVar187._0_4_ = auVar84._0_4_;
  auVar187._8_4_ = auVar84._0_4_;
  auVar187._12_4_ = auVar84._0_4_;
  auVar21 = vshufps_avx(auVar84,auVar84,0x55);
  auVar83 = vshufps_avx(auVar84,auVar84,0xaa);
  fVar160 = auVar83._0_4_;
  auVar161._0_4_ = fVar160 * auVar74._0_4_;
  fVar167 = auVar83._4_4_;
  auVar161._4_4_ = fVar167 * auVar74._4_4_;
  fVar168 = auVar83._8_4_;
  auVar161._8_4_ = fVar168 * auVar74._8_4_;
  fVar169 = auVar83._12_4_;
  auVar161._12_4_ = fVar169 * auVar74._12_4_;
  auVar142._0_4_ = auVar75._0_4_ * fVar160;
  auVar142._4_4_ = auVar75._4_4_ * fVar167;
  auVar142._8_4_ = auVar75._8_4_ * fVar168;
  auVar142._12_4_ = auVar75._12_4_ * fVar169;
  auVar134._0_4_ = auVar76._0_4_ * fVar160;
  auVar134._4_4_ = auVar76._4_4_ * fVar167;
  auVar134._8_4_ = auVar76._8_4_ * fVar168;
  auVar134._12_4_ = auVar76._12_4_ * fVar169;
  auVar83 = vfmadd231ps_fma(auVar161,auVar21,auVar79);
  auVar78 = vfmadd231ps_fma(auVar142,auVar21,auVar19);
  auVar21 = vfmadd231ps_fma(auVar134,auVar20,auVar21);
  auVar77 = vfmadd231ps_fma(auVar83,auVar187,auVar81);
  auVar78 = vfmadd231ps_fma(auVar78,auVar187,auVar80);
  auVar84 = vfmadd231ps_fma(auVar21,auVar82,auVar187);
  auVar188._4_4_ = auVar149._0_4_;
  auVar188._0_4_ = auVar149._0_4_;
  auVar188._8_4_ = auVar149._0_4_;
  auVar188._12_4_ = auVar149._0_4_;
  auVar21 = vshufps_avx(auVar149,auVar149,0x55);
  auVar83 = vshufps_avx(auVar149,auVar149,0xaa);
  auVar74 = vmulps_avx512vl(auVar83,auVar74);
  auVar150._0_4_ = auVar83._0_4_ * auVar75._0_4_;
  auVar150._4_4_ = auVar83._4_4_ * auVar75._4_4_;
  auVar150._8_4_ = auVar83._8_4_ * auVar75._8_4_;
  auVar150._12_4_ = auVar83._12_4_ * auVar75._12_4_;
  auVar144._0_4_ = auVar83._0_4_ * auVar76._0_4_;
  auVar144._4_4_ = auVar83._4_4_ * auVar76._4_4_;
  auVar144._8_4_ = auVar83._8_4_ * auVar76._8_4_;
  auVar144._12_4_ = auVar83._12_4_ * auVar76._12_4_;
  auVar75 = vfmadd231ps_avx512vl(auVar74,auVar21,auVar79);
  auVar79 = vfmadd231ps_fma(auVar150,auVar21,auVar19);
  auVar74 = vfmadd231ps_fma(auVar144,auVar21,auVar20);
  auVar76 = vfmadd231ps_avx512vl(auVar75,auVar188,auVar81);
  auVar75 = vfmadd231ps_fma(auVar79,auVar188,auVar80);
  auVar20 = vfmadd231ps_fma(auVar74,auVar188,auVar82);
  auVar178._8_4_ = 0x7fffffff;
  auVar178._0_8_ = 0x7fffffff7fffffff;
  auVar178._12_4_ = 0x7fffffff;
  auVar81 = vandps_avx(auVar77,auVar178);
  auVar175._8_4_ = 0x219392ef;
  auVar175._0_8_ = 0x219392ef219392ef;
  auVar175._12_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar81,auVar175,1);
  bVar66 = (bool)((byte)uVar70 & 1);
  auVar83._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar77._0_4_;
  bVar66 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar77._4_4_;
  bVar66 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar77._8_4_;
  bVar66 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar77._12_4_;
  auVar81 = vandps_avx(auVar78,auVar178);
  uVar70 = vcmpps_avx512vl(auVar81,auVar175,1);
  bVar66 = (bool)((byte)uVar70 & 1);
  auVar77._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._0_4_;
  bVar66 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._4_4_;
  bVar66 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._8_4_;
  bVar66 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar78._12_4_;
  auVar81 = vandps_avx(auVar84,auVar178);
  uVar70 = vcmpps_avx512vl(auVar81,auVar175,1);
  bVar66 = (bool)((byte)uVar70 & 1);
  auVar78._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar84._0_4_;
  bVar66 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar84._4_4_;
  bVar66 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar84._8_4_;
  bVar66 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar84._12_4_;
  auVar79 = vrcp14ps_avx512vl(auVar83);
  auVar176._8_4_ = 0x3f800000;
  auVar176._0_8_ = &DAT_3f8000003f800000;
  auVar176._12_4_ = 0x3f800000;
  auVar81 = vfnmadd213ps_fma(auVar83,auVar79,auVar176);
  auVar74 = vfmadd132ps_fma(auVar81,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar77);
  auVar81 = vfnmadd213ps_fma(auVar77,auVar79,auVar176);
  auVar19 = vfmadd132ps_fma(auVar81,auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar78);
  auVar81 = vfnmadd213ps_fma(auVar78,auVar79,auVar176);
  auVar82 = vfmadd132ps_fma(auVar81,auVar79,auVar79);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vsubps_avx512vl(auVar81,auVar76);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar81 = vpmovsxwd_avx(auVar79);
  auVar170._0_4_ = auVar74._0_4_ * auVar80._0_4_;
  auVar170._4_4_ = auVar74._4_4_ * auVar80._4_4_;
  auVar170._8_4_ = auVar74._8_4_ * auVar80._8_4_;
  auVar170._12_4_ = auVar74._12_4_ * auVar80._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx512vl(auVar81,auVar76);
  auVar162._0_4_ = auVar74._0_4_ * auVar81._0_4_;
  auVar162._4_4_ = auVar74._4_4_ * auVar81._4_4_;
  auVar162._8_4_ = auVar74._8_4_ * auVar81._8_4_;
  auVar162._12_4_ = auVar74._12_4_ * auVar81._12_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar79 = vpmovsxwd_avx(auVar74);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar71 * -2 + 6);
  auVar81 = vpmovsxwd_avx(auVar80);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar75);
  auVar179._0_4_ = auVar19._0_4_ * auVar81._0_4_;
  auVar179._4_4_ = auVar19._4_4_ * auVar81._4_4_;
  auVar179._8_4_ = auVar19._8_4_ * auVar81._8_4_;
  auVar179._12_4_ = auVar19._12_4_ * auVar81._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar79);
  auVar81 = vsubps_avx(auVar81,auVar75);
  auVar143._0_4_ = auVar19._0_4_ * auVar81._0_4_;
  auVar143._4_4_ = auVar19._4_4_ * auVar81._4_4_;
  auVar143._8_4_ = auVar19._8_4_ * auVar81._8_4_;
  auVar143._12_4_ = auVar19._12_4_ * auVar81._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar67 + uVar71 + 6);
  auVar81 = vpmovsxwd_avx(auVar19);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar20);
  auVar151._0_4_ = auVar82._0_4_ * auVar81._0_4_;
  auVar151._4_4_ = auVar82._4_4_ * auVar81._4_4_;
  auVar151._8_4_ = auVar82._8_4_ * auVar81._8_4_;
  auVar151._12_4_ = auVar82._12_4_ * auVar81._12_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 6);
  auVar81 = vpmovsxwd_avx(auVar75);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar20);
  auVar135._0_4_ = auVar82._0_4_ * auVar81._0_4_;
  auVar135._4_4_ = auVar82._4_4_ * auVar81._4_4_;
  auVar135._8_4_ = auVar82._8_4_ * auVar81._8_4_;
  auVar135._12_4_ = auVar82._12_4_ * auVar81._12_4_;
  auVar81 = vpminsd_avx(auVar170,auVar162);
  auVar79 = vpminsd_avx(auVar179,auVar143);
  auVar81 = vmaxps_avx(auVar81,auVar79);
  auVar79 = vpminsd_avx(auVar151,auVar135);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar82._4_4_ = uVar133;
  auVar82._0_4_ = uVar133;
  auVar82._8_4_ = uVar133;
  auVar82._12_4_ = uVar133;
  auVar79 = vmaxps_avx512vl(auVar79,auVar82);
  auVar81 = vmaxps_avx(auVar81,auVar79);
  auVar20._8_4_ = 0x3f7ffffa;
  auVar20._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar20._12_4_ = 0x3f7ffffa;
  local_1f0 = vmulps_avx512vl(auVar81,auVar20);
  auVar177 = ZEXT1664(local_1f0);
  auVar81 = vpmaxsd_avx(auVar170,auVar162);
  auVar147 = ZEXT1664(auVar81);
  auVar79 = vpmaxsd_avx(auVar179,auVar143);
  auVar81 = vminps_avx(auVar81,auVar79);
  auVar79 = vpmaxsd_avx(auVar151,auVar135);
  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar76._4_4_ = uVar133;
  auVar76._0_4_ = uVar133;
  auVar76._8_4_ = uVar133;
  auVar76._12_4_ = uVar133;
  auVar79 = vminps_avx512vl(auVar79,auVar76);
  auVar81 = vminps_avx(auVar81,auVar79);
  auVar21._8_4_ = 0x3f800003;
  auVar21._0_8_ = 0x3f8000033f800003;
  auVar21._12_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar21);
  auVar79 = vpbroadcastd_avx512vl();
  uVar141 = vcmpps_avx512vl(local_1f0,auVar81,2);
  uVar70 = vpcmpgtd_avx512vl(auVar79,_DAT_01ff0cf0);
  uVar70 = ((byte)uVar141 & 0xf) & uVar70;
  local_6f9 = (char)uVar70 != '\0';
  if (local_6f9) {
    local_548 = pre->ray_space + k;
    local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar146 = auVar177._0_32_;
      auVar114 = auVar147._0_32_;
      local_500 = in_ZMM20._0_32_;
      lVar23 = 0;
      for (uVar71 = uVar70; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      local_668 = (ulong)*(uint *)(prim + 2);
      pGVar10 = (context->scene->geometries).items[local_668].ptr;
      uVar71 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                               pGVar10[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar23 * 4 + 6));
      p_Var11 = pGVar10[1].intersectionFilterN;
      lVar23 = *(long *)&pGVar10[1].time_range.upper;
      auVar81 = *(undefined1 (*) [16])(lVar23 + (long)p_Var11 * uVar71);
      pauVar3 = (undefined1 (*) [16])(lVar23 + (uVar71 + 1) * (long)p_Var11);
      local_5b0 = *(undefined8 *)*pauVar3;
      uStack_5a8 = *(undefined8 *)(*pauVar3 + 8);
      auVar79 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar23 + (uVar71 + 2) * (long)p_Var11);
      local_5c0 = *(undefined8 *)*pauVar4;
      uStack_5b8 = *(undefined8 *)(*pauVar4 + 8);
      auVar74 = *pauVar4;
      uVar70 = uVar70 - 1 & uVar70;
      pauVar5 = (undefined1 (*) [16])(lVar23 + (uVar71 + 3) * (long)p_Var11);
      local_560 = *(undefined8 *)*pauVar5;
      uStack_558 = *(undefined8 *)(*pauVar5 + 8);
      auVar80 = *pauVar5;
      if (uVar70 != 0) {
        uVar67 = uVar70 - 1 & uVar70;
        for (uVar71 = uVar70; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
        }
        if (uVar67 != 0) {
          for (; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar82 = vsubps_avx(auVar81,auVar19);
      uVar133 = auVar82._0_4_;
      auVar145._4_4_ = uVar133;
      auVar145._0_4_ = uVar133;
      auVar145._8_4_ = uVar133;
      auVar145._12_4_ = uVar133;
      auVar75 = vshufps_avx(auVar82,auVar82,0x55);
      auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
      aVar6 = (local_548->vx).field_0;
      aVar7 = (local_548->vy).field_0;
      fVar160 = (local_548->vz).field_0.m128[0];
      fVar167 = *(float *)((long)&(local_548->vz).field_0 + 4);
      fVar168 = *(float *)((long)&(local_548->vz).field_0 + 8);
      fVar169 = *(float *)((long)&(local_548->vz).field_0 + 0xc);
      auVar182._0_4_ = fVar160 * auVar82._0_4_;
      auVar182._4_4_ = fVar167 * auVar82._4_4_;
      auVar182._8_4_ = fVar168 * auVar82._8_4_;
      auVar182._12_4_ = fVar169 * auVar82._12_4_;
      auVar75 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar7,auVar75);
      auVar76 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar6,auVar145);
      auVar75 = vshufps_avx(auVar81,auVar81,0xff);
      auVar20 = vsubps_avx(auVar79,auVar19);
      uVar133 = auVar20._0_4_;
      auVar152._4_4_ = uVar133;
      auVar152._0_4_ = uVar133;
      auVar152._8_4_ = uVar133;
      auVar152._12_4_ = uVar133;
      auVar82 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar183._0_4_ = fVar160 * auVar20._0_4_;
      auVar183._4_4_ = fVar167 * auVar20._4_4_;
      auVar183._8_4_ = fVar168 * auVar20._8_4_;
      auVar183._12_4_ = fVar169 * auVar20._12_4_;
      auVar82 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar7,auVar82);
      auVar21 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar6,auVar152);
      auVar79 = vshufps_avx(auVar79,auVar79,0xff);
      auVar20 = vsubps_avx(auVar74,auVar19);
      uVar133 = auVar20._0_4_;
      auVar180._4_4_ = uVar133;
      auVar180._0_4_ = uVar133;
      auVar180._8_4_ = uVar133;
      auVar180._12_4_ = uVar133;
      auVar82 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar185._0_4_ = fVar160 * auVar20._0_4_;
      auVar185._4_4_ = fVar167 * auVar20._4_4_;
      auVar185._8_4_ = fVar168 * auVar20._8_4_;
      auVar185._12_4_ = fVar169 * auVar20._12_4_;
      auVar82 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar7,auVar82);
      auVar20 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar6,auVar180);
      auVar74 = vshufps_avx(auVar74,auVar74,0xff);
      auVar82 = vsubps_avx512vl(auVar80,auVar19);
      uVar133 = auVar82._0_4_;
      auVar153._4_4_ = uVar133;
      auVar153._0_4_ = uVar133;
      auVar153._8_4_ = uVar133;
      auVar153._12_4_ = uVar133;
      auVar19 = vshufps_avx(auVar82,auVar82,0x55);
      auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
      auVar186._0_4_ = fVar160 * auVar82._0_4_;
      auVar186._4_4_ = fVar167 * auVar82._4_4_;
      auVar186._8_4_ = fVar168 * auVar82._8_4_;
      auVar186._12_4_ = fVar169 * auVar82._12_4_;
      auVar19 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar7,auVar19);
      auVar19 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar6,auVar153);
      lVar23 = (long)iVar9 * 0x44;
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23);
      auVar82 = vshufps_avx512vl(auVar80,auVar80,0xff);
      local_4c0 = vbroadcastss_avx512vl(auVar76);
      auVar87._8_4_ = 1;
      auVar87._0_8_ = 0x100000001;
      auVar87._12_4_ = 1;
      auVar87._16_4_ = 1;
      auVar87._20_4_ = 1;
      auVar87._24_4_ = 1;
      auVar87._28_4_ = 1;
      local_580 = vpermps_avx512vl(auVar87,ZEXT1632(auVar76));
      uVar141 = auVar75._0_8_;
      local_80._8_8_ = uVar141;
      local_80._0_8_ = uVar141;
      local_80._16_8_ = uVar141;
      local_80._24_8_ = uVar141;
      auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x484);
      uVar133 = auVar21._0_4_;
      local_5a0._4_4_ = uVar133;
      local_5a0._0_4_ = uVar133;
      local_5a0._8_4_ = uVar133;
      local_5a0._12_4_ = uVar133;
      local_5a0._16_4_ = uVar133;
      local_5a0._20_4_ = uVar133;
      local_5a0._24_4_ = uVar133;
      local_5a0._28_4_ = uVar133;
      local_1e0 = vpermps_avx512vl(auVar87,ZEXT1632(auVar21));
      uVar141 = auVar79._0_8_;
      local_a0._8_8_ = uVar141;
      local_a0._0_8_ = uVar141;
      local_a0._16_8_ = uVar141;
      local_a0._24_8_ = uVar141;
      auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x908);
      local_c0 = vbroadcastss_avx512vl(auVar20);
      local_e0 = vpermps_avx512vl(auVar87,ZEXT1632(auVar20));
      local_100 = vbroadcastsd_avx512vl(auVar74);
      auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0xd8c);
      local_120 = vbroadcastss_avx512vl(auVar19);
      local_140 = vpermps_avx512vl(auVar87,ZEXT1632(auVar19));
      _local_160 = vbroadcastsd_avx512vl(auVar82);
      auVar87 = vmulps_avx512vl(local_120,auVar101);
      auVar88 = vmulps_avx512vl(local_140,auVar101);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_c0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_e0);
      auVar79 = vfmadd231ps_fma(auVar87,auVar104,local_5a0);
      auVar89 = vfmadd231ps_avx512vl(auVar88,auVar104,local_1e0);
      auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar103,local_4c0);
      auVar87 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23);
      auVar88 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x484);
      auVar91 = vfmadd231ps_avx512vl(auVar89,auVar103,local_580);
      auVar89 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x908);
      auVar100 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0xd8c);
      auVar92 = vmulps_avx512vl(local_120,auVar100);
      auVar93 = vmulps_avx512vl(local_140,auVar100);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_c0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_e0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_5a0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,local_1e0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar87,local_4c0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar87,local_580);
      auVar94 = vsubps_avx512vl(auVar92,auVar90);
      auVar95 = vsubps_avx512vl(auVar93,auVar91);
      auVar96 = vmulps_avx512vl(auVar91,auVar94);
      auVar97 = vmulps_avx512vl(auVar90,auVar95);
      auVar96 = vsubps_avx512vl(auVar96,auVar97);
      auVar97 = vmulps_avx512vl(_local_160,auVar101);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_100);
      auVar79 = vfmadd231ps_fma(auVar97,auVar104,local_a0);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar103,local_80);
      auVar98 = vmulps_avx512vl(_local_160,auVar100);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,local_100);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,local_a0);
      auVar75 = vfmadd231ps_fma(auVar98,auVar87,local_80);
      auVar98 = vmulps_avx512vl(auVar95,auVar95);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar94);
      auVar99 = vmaxps_avx512vl(auVar97,ZEXT1632(auVar75));
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      auVar98 = vmulps_avx512vl(auVar99,auVar98);
      auVar96 = vmulps_avx512vl(auVar96,auVar96);
      uVar141 = vcmpps_avx512vl(auVar96,auVar98,2);
      auVar79 = vblendps_avx(auVar76,auVar81,8);
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar74 = vandps_avx512vl(auVar79,auVar82);
      auVar79 = vblendps_avx(auVar21,*pauVar3,8);
      auVar79 = vandps_avx512vl(auVar79,auVar82);
      auVar74 = vmaxps_avx(auVar74,auVar79);
      auVar79 = vblendps_avx(auVar20,*pauVar4,8);
      auVar83 = vandps_avx512vl(auVar79,auVar82);
      auVar79 = vblendps_avx(auVar19,auVar80,8);
      auVar79 = vandps_avx512vl(auVar79,auVar82);
      auVar79 = vmaxps_avx(auVar83,auVar79);
      auVar79 = vmaxps_avx(auVar74,auVar79);
      auVar74 = vmovshdup_avx(auVar79);
      auVar74 = vmaxss_avx(auVar74,auVar79);
      auVar79 = vshufpd_avx(auVar79,auVar79,1);
      auVar79 = vmaxss_avx(auVar79,auVar74);
      local_5d0._0_4_ = (undefined4)iVar9;
      local_5d0._4_12_ = auVar76._4_12_;
      auVar98._4_4_ = local_5d0._0_4_;
      auVar98._0_4_ = local_5d0._0_4_;
      auVar98._8_4_ = local_5d0._0_4_;
      auVar98._12_4_ = local_5d0._0_4_;
      auVar98._16_4_ = local_5d0._0_4_;
      auVar98._20_4_ = local_5d0._0_4_;
      auVar98._24_4_ = local_5d0._0_4_;
      auVar98._28_4_ = local_5d0._0_4_;
      uVar22 = vcmpps_avx512vl(auVar98,_DAT_02020f40,0xe);
      local_310 = (byte)uVar141 & (byte)uVar22;
      local_480 = auVar79._0_4_ * 4.7683716e-07;
      auVar96._8_4_ = 2;
      auVar96._0_8_ = 0x200000002;
      auVar96._12_4_ = 2;
      auVar96._16_4_ = 2;
      auVar96._20_4_ = 2;
      auVar96._24_4_ = 2;
      auVar96._28_4_ = 2;
      local_180 = vpermps_avx512vl(auVar96,ZEXT1632(auVar76));
      local_1a0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar21));
      local_1c0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar20));
      local_4e0 = vpermps_avx2(auVar96,ZEXT1632(auVar19));
      uVar68 = *(uint *)(ray + k * 4 + 0x30);
      auVar79 = local_e0._0_16_;
      local_630 = ZEXT416((uint)local_480);
      if (local_310 == 0) {
        bVar66 = false;
        auVar79 = vxorps_avx512vl(auVar79,auVar79);
        auVar196 = ZEXT1664(auVar79);
        auVar177 = ZEXT3264(auVar146);
        in_ZMM20 = ZEXT3264(local_500);
        auVar147 = ZEXT3264(auVar114);
        auVar194 = ZEXT3264(local_520);
        auVar195 = ZEXT3264(local_4c0);
        auVar193 = ZEXT3264(local_580);
        auVar192 = ZEXT3264(local_5a0);
      }
      else {
        local_540._0_16_ = ZEXT416(uVar68);
        auVar100 = vmulps_avx512vl(local_4e0,auVar100);
        auVar89 = vfmadd213ps_avx512vl(auVar89,local_1c0,auVar100);
        auVar88 = vfmadd213ps_avx512vl(auVar88,local_1a0,auVar89);
        auVar96 = vfmadd213ps_avx512vl(auVar87,local_180,auVar88);
        auVar101 = vmulps_avx512vl(local_4e0,auVar101);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_1c0,auVar101);
        auVar88 = vfmadd213ps_avx512vl(auVar104,local_1a0,auVar102);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1210);
        auVar102 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1694);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1b18);
        auVar87 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar23 + 0x1f9c);
        auVar98 = vfmadd213ps_avx512vl(auVar103,local_180,auVar88);
        auVar88 = vmulps_avx512vl(local_120,auVar87);
        auVar89 = vmulps_avx512vl(local_140,auVar87);
        auVar103._4_4_ = local_4e0._4_4_ * auVar87._4_4_;
        auVar103._0_4_ = local_4e0._0_4_ * auVar87._0_4_;
        auVar103._8_4_ = local_4e0._8_4_ * auVar87._8_4_;
        auVar103._12_4_ = local_4e0._12_4_ * auVar87._12_4_;
        auVar103._16_4_ = local_4e0._16_4_ * auVar87._16_4_;
        auVar103._20_4_ = local_4e0._20_4_ * auVar87._20_4_;
        auVar103._24_4_ = local_4e0._24_4_ * auVar87._24_4_;
        auVar103._28_4_ = auVar87._28_4_;
        auVar87 = vfmadd231ps_avx512vl(auVar88,auVar101,local_c0);
        auVar88 = vfmadd231ps_avx512vl(auVar89,auVar101,local_e0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_1c0,auVar101);
        auVar101 = vfmadd231ps_avx512vl(auVar87,auVar102,local_5a0);
        auVar87 = vfmadd231ps_avx512vl(auVar88,auVar102,local_1e0);
        auVar88 = vfmadd231ps_avx512vl(auVar103,local_1a0,auVar102);
        auVar89 = vfmadd231ps_avx512vl(auVar101,auVar104,local_4c0);
        auVar193 = ZEXT3264(local_580);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar104,local_580);
        auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1210);
        auVar102 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1b18);
        auVar101 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1f9c);
        auVar88 = vfmadd231ps_avx512vl(auVar88,local_180,auVar104);
        auVar100 = vmulps_avx512vl(local_120,auVar101);
        auVar99 = vmulps_avx512vl(local_140,auVar101);
        auVar104._4_4_ = local_4e0._4_4_ * auVar101._4_4_;
        auVar104._0_4_ = local_4e0._0_4_ * auVar101._0_4_;
        auVar104._8_4_ = local_4e0._8_4_ * auVar101._8_4_;
        auVar104._12_4_ = local_4e0._12_4_ * auVar101._12_4_;
        auVar104._16_4_ = local_4e0._16_4_ * auVar101._16_4_;
        auVar104._20_4_ = local_4e0._20_4_ * auVar101._20_4_;
        auVar104._24_4_ = local_4e0._24_4_ * auVar101._24_4_;
        auVar104._28_4_ = auVar101._28_4_;
        auVar101 = vfmadd231ps_avx512vl(auVar100,auVar102,local_c0);
        auVar100 = vfmadd231ps_avx512vl(auVar99,auVar102,local_e0);
        auVar102 = vfmadd231ps_avx512vl(auVar104,local_1c0,auVar102);
        auVar104 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar23 + 0x1694);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar104,local_5a0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,local_1e0);
        auVar104 = vfmadd231ps_avx512vl(auVar102,local_1a0,auVar104);
        auVar102 = vfmadd231ps_avx512vl(auVar101,auVar103,local_4c0);
        auVar101 = vfmadd231ps_avx512vl(auVar100,auVar103,local_580);
        auVar100 = vfmadd231ps_avx512vl(auVar104,local_180,auVar103);
        auVar190._8_4_ = 0x7fffffff;
        auVar190._0_8_ = 0x7fffffff7fffffff;
        auVar190._12_4_ = 0x7fffffff;
        auVar190._16_4_ = 0x7fffffff;
        auVar190._20_4_ = 0x7fffffff;
        auVar190._24_4_ = 0x7fffffff;
        auVar190._28_4_ = 0x7fffffff;
        auVar103 = vandps_avx(auVar89,auVar190);
        auVar104 = vandps_avx(auVar87,auVar190);
        auVar104 = vmaxps_avx(auVar103,auVar104);
        auVar103 = vandps_avx(auVar88,auVar190);
        auVar103 = vmaxps_avx(auVar104,auVar103);
        auVar88 = vbroadcastss_avx512vl(local_630);
        uVar71 = vcmpps_avx512vl(auVar103,auVar88,1);
        bVar66 = (bool)((byte)uVar71 & 1);
        auVar99._0_4_ = (float)((uint)bVar66 * auVar94._0_4_ | (uint)!bVar66 * auVar89._0_4_);
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar66 * auVar94._4_4_ | (uint)!bVar66 * auVar89._4_4_);
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar66 * auVar94._8_4_ | (uint)!bVar66 * auVar89._8_4_);
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar66 * auVar94._12_4_ | (uint)!bVar66 * auVar89._12_4_);
        bVar66 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar66 * auVar94._16_4_ | (uint)!bVar66 * auVar89._16_4_);
        bVar66 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar66 * auVar94._20_4_ | (uint)!bVar66 * auVar89._20_4_);
        bVar66 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar66 * auVar94._24_4_ | (uint)!bVar66 * auVar89._24_4_);
        bVar66 = SUB81(uVar71 >> 7,0);
        auVar99._28_4_ = (uint)bVar66 * auVar94._28_4_ | (uint)!bVar66 * auVar89._28_4_;
        bVar66 = (bool)((byte)uVar71 & 1);
        auVar105._0_4_ = (float)((uint)bVar66 * auVar95._0_4_ | (uint)!bVar66 * auVar87._0_4_);
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar66 * auVar95._4_4_ | (uint)!bVar66 * auVar87._4_4_);
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar66 * auVar95._8_4_ | (uint)!bVar66 * auVar87._8_4_);
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar66 * auVar95._12_4_ | (uint)!bVar66 * auVar87._12_4_);
        bVar66 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar66 * auVar95._16_4_ | (uint)!bVar66 * auVar87._16_4_);
        bVar66 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar66 * auVar95._20_4_ | (uint)!bVar66 * auVar87._20_4_);
        bVar66 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar66 * auVar95._24_4_ | (uint)!bVar66 * auVar87._24_4_);
        bVar66 = SUB81(uVar71 >> 7,0);
        auVar105._28_4_ = (uint)bVar66 * auVar95._28_4_ | (uint)!bVar66 * auVar87._28_4_;
        auVar103 = vandps_avx(auVar190,auVar102);
        auVar104 = vandps_avx(auVar101,auVar190);
        auVar104 = vmaxps_avx(auVar103,auVar104);
        auVar103 = vandps_avx(auVar100,auVar190);
        auVar103 = vmaxps_avx(auVar104,auVar103);
        uVar71 = vcmpps_avx512vl(auVar103,auVar88,1);
        bVar66 = (bool)((byte)uVar71 & 1);
        auVar106._0_4_ = (float)((uint)bVar66 * auVar94._0_4_ | (uint)!bVar66 * auVar102._0_4_);
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar66 * auVar94._4_4_ | (uint)!bVar66 * auVar102._4_4_);
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar66 * auVar94._8_4_ | (uint)!bVar66 * auVar102._8_4_);
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar66 * auVar94._12_4_ | (uint)!bVar66 * auVar102._12_4_);
        bVar66 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar66 * auVar94._16_4_ | (uint)!bVar66 * auVar102._16_4_);
        bVar66 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar66 * auVar94._20_4_ | (uint)!bVar66 * auVar102._20_4_);
        bVar66 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar66 * auVar94._24_4_ | (uint)!bVar66 * auVar102._24_4_);
        bVar66 = SUB81(uVar71 >> 7,0);
        auVar106._28_4_ = (uint)bVar66 * auVar94._28_4_ | (uint)!bVar66 * auVar102._28_4_;
        bVar66 = (bool)((byte)uVar71 & 1);
        auVar107._0_4_ = (float)((uint)bVar66 * auVar95._0_4_ | (uint)!bVar66 * auVar101._0_4_);
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar66 * auVar95._4_4_ | (uint)!bVar66 * auVar101._4_4_);
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar66 * auVar95._8_4_ | (uint)!bVar66 * auVar101._8_4_);
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar66 * auVar95._12_4_ | (uint)!bVar66 * auVar101._12_4_);
        bVar66 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar66 * auVar95._16_4_ | (uint)!bVar66 * auVar101._16_4_);
        bVar66 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar66 * auVar95._20_4_ | (uint)!bVar66 * auVar101._20_4_);
        bVar66 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar66 * auVar95._24_4_ | (uint)!bVar66 * auVar101._24_4_);
        bVar66 = SUB81(uVar71 >> 7,0);
        auVar107._28_4_ = (uint)bVar66 * auVar95._28_4_ | (uint)!bVar66 * auVar101._28_4_;
        auVar84 = vxorps_avx512vl(auVar79,auVar79);
        auVar196 = ZEXT1664(auVar84);
        auVar103 = vfmadd213ps_avx512vl(auVar99,auVar99,ZEXT1632(auVar84));
        auVar79 = vfmadd231ps_fma(auVar103,auVar105,auVar105);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
        fVar160 = auVar103._0_4_;
        fVar167 = auVar103._4_4_;
        fVar168 = auVar103._8_4_;
        fVar169 = auVar103._12_4_;
        fVar148 = auVar103._16_4_;
        fVar159 = auVar103._20_4_;
        fVar72 = auVar103._24_4_;
        auVar102._4_4_ = fVar167 * fVar167 * fVar167 * auVar79._4_4_ * -0.5;
        auVar102._0_4_ = fVar160 * fVar160 * fVar160 * auVar79._0_4_ * -0.5;
        auVar102._8_4_ = fVar168 * fVar168 * fVar168 * auVar79._8_4_ * -0.5;
        auVar102._12_4_ = fVar169 * fVar169 * fVar169 * auVar79._12_4_ * -0.5;
        auVar102._16_4_ = fVar148 * fVar148 * fVar148 * -0.0;
        auVar102._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
        auVar102._24_4_ = fVar72 * fVar72 * fVar72 * -0.0;
        auVar102._28_4_ = 0;
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar103);
        auVar101._4_4_ = auVar105._4_4_ * auVar102._4_4_;
        auVar101._0_4_ = auVar105._0_4_ * auVar102._0_4_;
        auVar101._8_4_ = auVar105._8_4_ * auVar102._8_4_;
        auVar101._12_4_ = auVar105._12_4_ * auVar102._12_4_;
        auVar101._16_4_ = auVar105._16_4_ * auVar102._16_4_;
        auVar101._20_4_ = auVar105._20_4_ * auVar102._20_4_;
        auVar101._24_4_ = auVar105._24_4_ * auVar102._24_4_;
        auVar101._28_4_ = auVar103._28_4_;
        auVar88._4_4_ = auVar102._4_4_ * -auVar99._4_4_;
        auVar88._0_4_ = auVar102._0_4_ * -auVar99._0_4_;
        auVar88._8_4_ = auVar102._8_4_ * -auVar99._8_4_;
        auVar88._12_4_ = auVar102._12_4_ * -auVar99._12_4_;
        auVar88._16_4_ = auVar102._16_4_ * -auVar99._16_4_;
        auVar88._20_4_ = auVar102._20_4_ * -auVar99._20_4_;
        auVar88._24_4_ = auVar102._24_4_ * -auVar99._24_4_;
        auVar88._28_4_ = auVar99._28_4_ ^ 0x80000000;
        auVar103 = vmulps_avx512vl(auVar102,ZEXT1632(auVar84));
        auVar95 = ZEXT1632(auVar84);
        auVar87 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar95);
        auVar79 = vfmadd231ps_fma(auVar87,auVar107,auVar107);
        auVar87 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
        fVar160 = auVar87._0_4_;
        fVar167 = auVar87._4_4_;
        fVar168 = auVar87._8_4_;
        fVar169 = auVar87._12_4_;
        fVar148 = auVar87._16_4_;
        fVar159 = auVar87._20_4_;
        fVar72 = auVar87._24_4_;
        auVar89._4_4_ = fVar167 * fVar167 * fVar167 * auVar79._4_4_ * -0.5;
        auVar89._0_4_ = fVar160 * fVar160 * fVar160 * auVar79._0_4_ * -0.5;
        auVar89._8_4_ = fVar168 * fVar168 * fVar168 * auVar79._8_4_ * -0.5;
        auVar89._12_4_ = fVar169 * fVar169 * fVar169 * auVar79._12_4_ * -0.5;
        auVar89._16_4_ = fVar148 * fVar148 * fVar148 * -0.0;
        auVar89._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
        auVar89._24_4_ = fVar72 * fVar72 * fVar72 * -0.0;
        auVar89._28_4_ = 0;
        auVar104 = vfmadd231ps_avx512vl(auVar89,auVar104,auVar87);
        auVar100._4_4_ = auVar107._4_4_ * auVar104._4_4_;
        auVar100._0_4_ = auVar107._0_4_ * auVar104._0_4_;
        auVar100._8_4_ = auVar107._8_4_ * auVar104._8_4_;
        auVar100._12_4_ = auVar107._12_4_ * auVar104._12_4_;
        auVar100._16_4_ = auVar107._16_4_ * auVar104._16_4_;
        auVar100._20_4_ = auVar107._20_4_ * auVar104._20_4_;
        auVar100._24_4_ = auVar107._24_4_ * auVar104._24_4_;
        auVar100._28_4_ = auVar87._28_4_;
        auVar94._4_4_ = -auVar106._4_4_ * auVar104._4_4_;
        auVar94._0_4_ = -auVar106._0_4_ * auVar104._0_4_;
        auVar94._8_4_ = -auVar106._8_4_ * auVar104._8_4_;
        auVar94._12_4_ = -auVar106._12_4_ * auVar104._12_4_;
        auVar94._16_4_ = -auVar106._16_4_ * auVar104._16_4_;
        auVar94._20_4_ = -auVar106._20_4_ * auVar104._20_4_;
        auVar94._24_4_ = -auVar106._24_4_ * auVar104._24_4_;
        auVar94._28_4_ = auVar102._28_4_;
        auVar104 = vmulps_avx512vl(auVar104,auVar95);
        auVar79 = vfmadd213ps_fma(auVar101,auVar97,auVar90);
        auVar74 = vfmadd213ps_fma(auVar88,auVar97,auVar91);
        auVar102 = vfmadd213ps_avx512vl(auVar103,auVar97,auVar98);
        auVar87 = vfmadd213ps_avx512vl(auVar100,ZEXT1632(auVar75),auVar92);
        auVar76 = vfnmadd213ps_fma(auVar101,auVar97,auVar90);
        auVar89 = ZEXT1632(auVar75);
        auVar80 = vfmadd213ps_fma(auVar94,auVar89,auVar93);
        auVar21 = vfnmadd213ps_fma(auVar88,auVar97,auVar91);
        auVar19 = vfmadd213ps_fma(auVar104,auVar89,auVar96);
        auVar101 = vfnmadd231ps_avx512vl(auVar98,auVar97,auVar103);
        auVar83 = vfnmadd213ps_fma(auVar100,auVar89,auVar92);
        auVar78 = vfnmadd213ps_fma(auVar94,auVar89,auVar93);
        auVar77 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar75),auVar104);
        auVar104 = vsubps_avx512vl(auVar87,ZEXT1632(auVar76));
        auVar103 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar21));
        auVar88 = vsubps_avx512vl(ZEXT1632(auVar19),auVar101);
        auVar89 = vmulps_avx512vl(auVar103,auVar101);
        auVar82 = vfmsub231ps_fma(auVar89,ZEXT1632(auVar21),auVar88);
        auVar90._4_4_ = auVar76._4_4_ * auVar88._4_4_;
        auVar90._0_4_ = auVar76._0_4_ * auVar88._0_4_;
        auVar90._8_4_ = auVar76._8_4_ * auVar88._8_4_;
        auVar90._12_4_ = auVar76._12_4_ * auVar88._12_4_;
        auVar90._16_4_ = auVar88._16_4_ * 0.0;
        auVar90._20_4_ = auVar88._20_4_ * 0.0;
        auVar90._24_4_ = auVar88._24_4_ * 0.0;
        auVar90._28_4_ = auVar88._28_4_;
        auVar88 = vfmsub231ps_avx512vl(auVar90,auVar101,auVar104);
        auVar91._4_4_ = auVar21._4_4_ * auVar104._4_4_;
        auVar91._0_4_ = auVar21._0_4_ * auVar104._0_4_;
        auVar91._8_4_ = auVar21._8_4_ * auVar104._8_4_;
        auVar91._12_4_ = auVar21._12_4_ * auVar104._12_4_;
        auVar91._16_4_ = auVar104._16_4_ * 0.0;
        auVar91._20_4_ = auVar104._20_4_ * 0.0;
        auVar91._24_4_ = auVar104._24_4_ * 0.0;
        auVar91._28_4_ = auVar104._28_4_;
        auVar20 = vfmsub231ps_fma(auVar91,ZEXT1632(auVar76),auVar103);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar95,auVar88);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,ZEXT1632(auVar82));
        auVar94 = ZEXT1632(auVar84);
        uVar71 = vcmpps_avx512vl(auVar103,auVar94,2);
        bVar64 = (byte)uVar71;
        fVar72 = (float)((uint)(bVar64 & 1) * auVar79._0_4_ |
                        (uint)!(bool)(bVar64 & 1) * auVar83._0_4_);
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar124 = (float)((uint)bVar66 * auVar79._4_4_ | (uint)!bVar66 * auVar83._4_4_);
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar126 = (float)((uint)bVar66 * auVar79._8_4_ | (uint)!bVar66 * auVar83._8_4_);
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar129 = (float)((uint)bVar66 * auVar79._12_4_ | (uint)!bVar66 * auVar83._12_4_);
        auVar89 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar126,CONCAT44(fVar124,fVar72))));
        fVar73 = (float)((uint)(bVar64 & 1) * auVar74._0_4_ |
                        (uint)!(bool)(bVar64 & 1) * auVar78._0_4_);
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar125 = (float)((uint)bVar66 * auVar74._4_4_ | (uint)!bVar66 * auVar78._4_4_);
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar127 = (float)((uint)bVar66 * auVar74._8_4_ | (uint)!bVar66 * auVar78._8_4_);
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar130 = (float)((uint)bVar66 * auVar74._12_4_ | (uint)!bVar66 * auVar78._12_4_);
        auVar100 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar127,CONCAT44(fVar125,fVar73))));
        auVar108._0_4_ =
             (float)((uint)(bVar64 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar77._0_4_
                    );
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar66 * auVar102._4_4_ | (uint)!bVar66 * auVar77._4_4_);
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar66 * auVar102._8_4_ | (uint)!bVar66 * auVar77._8_4_);
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar66 * auVar102._12_4_ | (uint)!bVar66 * auVar77._12_4_);
        fVar167 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar102._16_4_);
        auVar108._16_4_ = fVar167;
        fVar160 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar102._20_4_);
        auVar108._20_4_ = fVar160;
        fVar168 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar102._24_4_);
        auVar108._24_4_ = fVar168;
        iVar1 = (uint)(byte)(uVar71 >> 7) * auVar102._28_4_;
        auVar108._28_4_ = iVar1;
        auVar104 = vblendmps_avx512vl(ZEXT1632(auVar76),auVar87);
        auVar109._0_4_ =
             (uint)(bVar64 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar82._0_4_;
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar66 * auVar104._4_4_ | (uint)!bVar66 * auVar82._4_4_;
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar66 * auVar104._8_4_ | (uint)!bVar66 * auVar82._8_4_;
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar66 * auVar104._12_4_ | (uint)!bVar66 * auVar82._12_4_;
        auVar109._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar104._16_4_;
        auVar109._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar104._20_4_;
        auVar109._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar104._24_4_;
        auVar109._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar104._28_4_;
        auVar104 = vblendmps_avx512vl(ZEXT1632(auVar21),ZEXT1632(auVar80));
        auVar110._0_4_ =
             (float)((uint)(bVar64 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar74._0_4_
                    );
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar66 * auVar104._4_4_ | (uint)!bVar66 * auVar74._4_4_);
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar66 * auVar104._8_4_ | (uint)!bVar66 * auVar74._8_4_);
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar66 * auVar104._12_4_ | (uint)!bVar66 * auVar74._12_4_);
        fVar169 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar104._16_4_);
        auVar110._16_4_ = fVar169;
        fVar148 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar104._20_4_);
        auVar110._20_4_ = fVar148;
        fVar159 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar104._24_4_);
        auVar110._24_4_ = fVar159;
        auVar110._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar104._28_4_;
        auVar104 = vblendmps_avx512vl(auVar101,ZEXT1632(auVar19));
        auVar111._0_4_ =
             (float)((uint)(bVar64 & 1) * auVar104._0_4_ |
                    (uint)!(bool)(bVar64 & 1) * auVar102._0_4_);
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar66 * auVar104._4_4_ | (uint)!bVar66 * auVar102._4_4_);
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar66 * auVar104._8_4_ | (uint)!bVar66 * auVar102._8_4_);
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar66 * auVar104._12_4_ | (uint)!bVar66 * auVar102._12_4_);
        bVar66 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar66 * auVar104._16_4_ | (uint)!bVar66 * auVar102._16_4_);
        bVar66 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar66 * auVar104._20_4_ | (uint)!bVar66 * auVar102._20_4_);
        bVar66 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar66 * auVar104._24_4_ | (uint)!bVar66 * auVar102._24_4_);
        bVar66 = SUB81(uVar71 >> 7,0);
        auVar111._28_4_ = (uint)bVar66 * auVar104._28_4_ | (uint)!bVar66 * auVar102._28_4_;
        auVar112._0_4_ =
             (uint)(bVar64 & 1) * (int)auVar76._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar87._0_4_;
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar66 * (int)auVar76._4_4_ | (uint)!bVar66 * auVar87._4_4_;
        bVar66 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar66 * (int)auVar76._8_4_ | (uint)!bVar66 * auVar87._8_4_;
        bVar66 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar66 * (int)auVar76._12_4_ | (uint)!bVar66 * auVar87._12_4_;
        auVar112._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar87._16_4_;
        auVar112._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar87._20_4_;
        auVar112._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar87._24_4_;
        auVar112._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar87._28_4_;
        bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar113._0_4_ =
             (uint)(bVar64 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar19._0_4_;
        bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar19._4_4_;
        bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar19._8_4_;
        bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar19._12_4_;
        auVar113._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar101._16_4_;
        auVar113._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar101._20_4_;
        auVar113._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar101._24_4_;
        iVar2 = (uint)(byte)(uVar71 >> 7) * auVar101._28_4_;
        auVar113._28_4_ = iVar2;
        auVar90 = vsubps_avx512vl(auVar112,auVar89);
        auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar21._12_4_ |
                                                 (uint)!bVar14 * auVar80._12_4_,
                                                 CONCAT48((uint)bVar13 * (int)auVar21._8_4_ |
                                                          (uint)!bVar13 * auVar80._8_4_,
                                                          CONCAT44((uint)bVar66 * (int)auVar21._4_4_
                                                                   | (uint)!bVar66 * auVar80._4_4_,
                                                                   (uint)(bVar64 & 1) *
                                                                   (int)auVar21._0_4_ |
                                                                   (uint)!(bool)(bVar64 & 1) *
                                                                   auVar80._0_4_)))),auVar100);
        auVar102 = vsubps_avx(auVar113,auVar108);
        auVar101 = vsubps_avx(auVar89,auVar109);
        auVar87 = vsubps_avx(auVar100,auVar110);
        auVar88 = vsubps_avx(auVar108,auVar111);
        auVar92._4_4_ = auVar102._4_4_ * fVar124;
        auVar92._0_4_ = auVar102._0_4_ * fVar72;
        auVar92._8_4_ = auVar102._8_4_ * fVar126;
        auVar92._12_4_ = auVar102._12_4_ * fVar129;
        auVar92._16_4_ = auVar102._16_4_ * 0.0;
        auVar92._20_4_ = auVar102._20_4_ * 0.0;
        auVar92._24_4_ = auVar102._24_4_ * 0.0;
        auVar92._28_4_ = iVar2;
        auVar79 = vfmsub231ps_fma(auVar92,auVar108,auVar90);
        auVar93._4_4_ = fVar125 * auVar90._4_4_;
        auVar93._0_4_ = fVar73 * auVar90._0_4_;
        auVar93._8_4_ = fVar127 * auVar90._8_4_;
        auVar93._12_4_ = fVar130 * auVar90._12_4_;
        auVar93._16_4_ = auVar90._16_4_ * 0.0;
        auVar93._20_4_ = auVar90._20_4_ * 0.0;
        auVar93._24_4_ = auVar90._24_4_ * 0.0;
        auVar93._28_4_ = auVar103._28_4_;
        auVar74 = vfmsub231ps_fma(auVar93,auVar89,auVar104);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar94,ZEXT1632(auVar79));
        auVar163._0_4_ = auVar104._0_4_ * auVar108._0_4_;
        auVar163._4_4_ = auVar104._4_4_ * auVar108._4_4_;
        auVar163._8_4_ = auVar104._8_4_ * auVar108._8_4_;
        auVar163._12_4_ = auVar104._12_4_ * auVar108._12_4_;
        auVar163._16_4_ = auVar104._16_4_ * fVar167;
        auVar163._20_4_ = auVar104._20_4_ * fVar160;
        auVar163._24_4_ = auVar104._24_4_ * fVar168;
        auVar163._28_4_ = 0;
        auVar79 = vfmsub231ps_fma(auVar163,auVar100,auVar102);
        auVar91 = vfmadd231ps_avx512vl(auVar103,auVar94,ZEXT1632(auVar79));
        auVar103 = vmulps_avx512vl(auVar88,auVar109);
        auVar103 = vfmsub231ps_avx512vl(auVar103,auVar101,auVar111);
        auVar95._4_4_ = auVar87._4_4_ * auVar111._4_4_;
        auVar95._0_4_ = auVar87._0_4_ * auVar111._0_4_;
        auVar95._8_4_ = auVar87._8_4_ * auVar111._8_4_;
        auVar95._12_4_ = auVar87._12_4_ * auVar111._12_4_;
        auVar95._16_4_ = auVar87._16_4_ * auVar111._16_4_;
        auVar95._20_4_ = auVar87._20_4_ * auVar111._20_4_;
        auVar95._24_4_ = auVar87._24_4_ * auVar111._24_4_;
        auVar95._28_4_ = auVar111._28_4_;
        auVar79 = vfmsub231ps_fma(auVar95,auVar110,auVar88);
        auVar164._0_4_ = auVar110._0_4_ * auVar101._0_4_;
        auVar164._4_4_ = auVar110._4_4_ * auVar101._4_4_;
        auVar164._8_4_ = auVar110._8_4_ * auVar101._8_4_;
        auVar164._12_4_ = auVar110._12_4_ * auVar101._12_4_;
        auVar164._16_4_ = fVar169 * auVar101._16_4_;
        auVar164._20_4_ = fVar148 * auVar101._20_4_;
        auVar164._24_4_ = fVar159 * auVar101._24_4_;
        auVar164._28_4_ = 0;
        auVar74 = vfmsub231ps_fma(auVar164,auVar87,auVar109);
        auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar94,auVar103);
        auVar92 = vfmadd231ps_avx512vl(auVar103,auVar94,ZEXT1632(auVar79));
        auVar103 = vmaxps_avx(auVar91,auVar92);
        uVar141 = vcmpps_avx512vl(auVar103,auVar94,2);
        local_310 = local_310 & (byte)uVar141;
        in_ZMM20 = ZEXT3264(local_500);
        auVar195 = ZEXT3264(local_4c0);
        auVar192 = ZEXT3264(local_5a0);
        auVar189 = ZEXT1664(local_630);
        if (local_310 == 0) {
          local_310 = 0;
          auVar177 = ZEXT3264(auVar146);
          auVar147 = ZEXT3264(auVar114);
        }
        else {
          auVar32._4_4_ = auVar88._4_4_ * auVar104._4_4_;
          auVar32._0_4_ = auVar88._0_4_ * auVar104._0_4_;
          auVar32._8_4_ = auVar88._8_4_ * auVar104._8_4_;
          auVar32._12_4_ = auVar88._12_4_ * auVar104._12_4_;
          auVar32._16_4_ = auVar88._16_4_ * auVar104._16_4_;
          auVar32._20_4_ = auVar88._20_4_ * auVar104._20_4_;
          auVar32._24_4_ = auVar88._24_4_ * auVar104._24_4_;
          auVar32._28_4_ = auVar103._28_4_;
          auVar80 = vfmsub231ps_fma(auVar32,auVar87,auVar102);
          auVar33._4_4_ = auVar102._4_4_ * auVar101._4_4_;
          auVar33._0_4_ = auVar102._0_4_ * auVar101._0_4_;
          auVar33._8_4_ = auVar102._8_4_ * auVar101._8_4_;
          auVar33._12_4_ = auVar102._12_4_ * auVar101._12_4_;
          auVar33._16_4_ = auVar102._16_4_ * auVar101._16_4_;
          auVar33._20_4_ = auVar102._20_4_ * auVar101._20_4_;
          auVar33._24_4_ = auVar102._24_4_ * auVar101._24_4_;
          auVar33._28_4_ = auVar102._28_4_;
          auVar74 = vfmsub231ps_fma(auVar33,auVar90,auVar88);
          auVar34._4_4_ = auVar87._4_4_ * auVar90._4_4_;
          auVar34._0_4_ = auVar87._0_4_ * auVar90._0_4_;
          auVar34._8_4_ = auVar87._8_4_ * auVar90._8_4_;
          auVar34._12_4_ = auVar87._12_4_ * auVar90._12_4_;
          auVar34._16_4_ = auVar87._16_4_ * auVar90._16_4_;
          auVar34._20_4_ = auVar87._20_4_ * auVar90._20_4_;
          auVar34._24_4_ = auVar87._24_4_ * auVar90._24_4_;
          auVar34._28_4_ = auVar87._28_4_;
          auVar19 = vfmsub231ps_fma(auVar34,auVar101,auVar104);
          auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar74),ZEXT1632(auVar19));
          auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar80),auVar94);
          auVar104 = vrcp14ps_avx512vl(auVar103);
          auVar25._8_4_ = 0x3f800000;
          auVar25._0_8_ = &DAT_3f8000003f800000;
          auVar25._12_4_ = 0x3f800000;
          auVar25._16_4_ = 0x3f800000;
          auVar25._20_4_ = 0x3f800000;
          auVar25._24_4_ = 0x3f800000;
          auVar25._28_4_ = 0x3f800000;
          auVar102 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar25);
          auVar79 = vfmadd132ps_fma(auVar102,auVar104,auVar104);
          auVar35._4_4_ = auVar19._4_4_ * auVar108._4_4_;
          auVar35._0_4_ = auVar19._0_4_ * auVar108._0_4_;
          auVar35._8_4_ = auVar19._8_4_ * auVar108._8_4_;
          auVar35._12_4_ = auVar19._12_4_ * auVar108._12_4_;
          auVar35._16_4_ = fVar167 * 0.0;
          auVar35._20_4_ = fVar160 * 0.0;
          auVar35._24_4_ = fVar168 * 0.0;
          auVar35._28_4_ = iVar1;
          auVar74 = vfmadd231ps_fma(auVar35,auVar100,ZEXT1632(auVar74));
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar89,ZEXT1632(auVar80));
          fVar160 = auVar79._0_4_;
          fVar167 = auVar79._4_4_;
          fVar168 = auVar79._8_4_;
          fVar169 = auVar79._12_4_;
          auVar104 = ZEXT1632(CONCAT412(auVar74._12_4_ * fVar169,
                                        CONCAT48(auVar74._8_4_ * fVar168,
                                                 CONCAT44(auVar74._4_4_ * fVar167,
                                                          auVar74._0_4_ * fVar160))));
          auVar147 = ZEXT3264(auVar104);
          auVar181._4_4_ = uVar68;
          auVar181._0_4_ = uVar68;
          auVar181._8_4_ = uVar68;
          auVar181._12_4_ = uVar68;
          auVar181._16_4_ = uVar68;
          auVar181._20_4_ = uVar68;
          auVar181._24_4_ = uVar68;
          auVar181._28_4_ = uVar68;
          uVar141 = vcmpps_avx512vl(auVar181,auVar104,2);
          uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar26._4_4_ = uVar133;
          auVar26._0_4_ = uVar133;
          auVar26._8_4_ = uVar133;
          auVar26._12_4_ = uVar133;
          auVar26._16_4_ = uVar133;
          auVar26._20_4_ = uVar133;
          auVar26._24_4_ = uVar133;
          auVar26._28_4_ = uVar133;
          uVar22 = vcmpps_avx512vl(auVar104,auVar26,2);
          local_310 = (byte)uVar141 & (byte)uVar22 & local_310;
          if (local_310 == 0) {
            local_310 = 0;
            auVar177 = ZEXT3264(auVar146);
            auVar147 = ZEXT3264(auVar114);
          }
          else {
            uVar141 = vcmpps_avx512vl(auVar103,auVar94,4);
            if ((local_310 & (byte)uVar141) == 0) {
              local_310 = 0;
              auVar177 = ZEXT3264(auVar146);
              auVar147 = ZEXT3264(auVar114);
            }
            else {
              local_310 = local_310 & (byte)uVar141;
              fVar148 = auVar91._0_4_ * fVar160;
              fVar159 = auVar91._4_4_ * fVar167;
              auVar114._4_4_ = fVar159;
              auVar114._0_4_ = fVar148;
              fVar72 = auVar91._8_4_ * fVar168;
              auVar114._8_4_ = fVar72;
              fVar73 = auVar91._12_4_ * fVar169;
              auVar114._12_4_ = fVar73;
              fVar124 = auVar91._16_4_ * 0.0;
              auVar114._16_4_ = fVar124;
              fVar125 = auVar91._20_4_ * 0.0;
              auVar114._20_4_ = fVar125;
              fVar126 = auVar91._24_4_ * 0.0;
              auVar114._24_4_ = fVar126;
              auVar114._28_4_ = auVar91._28_4_;
              fVar160 = auVar92._0_4_ * fVar160;
              fVar167 = auVar92._4_4_ * fVar167;
              auVar146._4_4_ = fVar167;
              auVar146._0_4_ = fVar160;
              fVar168 = auVar92._8_4_ * fVar168;
              auVar146._8_4_ = fVar168;
              fVar169 = auVar92._12_4_ * fVar169;
              auVar146._12_4_ = fVar169;
              fVar127 = auVar92._16_4_ * 0.0;
              auVar146._16_4_ = fVar127;
              fVar129 = auVar92._20_4_ * 0.0;
              auVar146._20_4_ = fVar129;
              fVar130 = auVar92._24_4_ * 0.0;
              auVar146._24_4_ = fVar130;
              auVar146._28_4_ = auVar92._28_4_;
              auVar173._8_4_ = 0x3f800000;
              auVar173._0_8_ = &DAT_3f8000003f800000;
              auVar173._12_4_ = 0x3f800000;
              auVar173._16_4_ = 0x3f800000;
              auVar173._20_4_ = 0x3f800000;
              auVar173._24_4_ = 0x3f800000;
              auVar173._28_4_ = 0x3f800000;
              auVar114 = vsubps_avx(auVar173,auVar114);
              bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar71 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar71 >> 6) & 1);
              bVar17 = SUB81(uVar71 >> 7,0);
              auVar177 = ZEXT3264(CONCAT428((uint)bVar17 * auVar91._28_4_ |
                                            (uint)!bVar17 * auVar114._28_4_,
                                            CONCAT424((uint)bVar16 * (int)fVar126 |
                                                      (uint)!bVar16 * auVar114._24_4_,
                                                      CONCAT420((uint)bVar15 * (int)fVar125 |
                                                                (uint)!bVar15 * auVar114._20_4_,
                                                                CONCAT416((uint)bVar14 *
                                                                          (int)fVar124 |
                                                                          (uint)!bVar14 *
                                                                          auVar114._16_4_,
                                                                          CONCAT412((uint)bVar13 *
                                                                                    (int)fVar73 |
                                                                                    (uint)!bVar13 *
                                                                                    auVar114._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar12 * (int)fVar72 |
                                                  (uint)!bVar12 * auVar114._8_4_,
                                                  CONCAT44((uint)bVar66 * (int)fVar159 |
                                                           (uint)!bVar66 * auVar114._4_4_,
                                                           (uint)(bVar64 & 1) * (int)fVar148 |
                                                           (uint)!(bool)(bVar64 & 1) *
                                                           auVar114._0_4_))))))));
              auVar114 = vsubps_avx(auVar173,auVar146);
              bVar66 = (bool)((byte)(uVar71 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar71 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar71 >> 6) & 1);
              bVar17 = SUB81(uVar71 >> 7,0);
              local_240._4_4_ = (uint)bVar66 * (int)fVar167 | (uint)!bVar66 * auVar114._4_4_;
              local_240._0_4_ =
                   (uint)(bVar64 & 1) * (int)fVar160 | (uint)!(bool)(bVar64 & 1) * auVar114._0_4_;
              local_240._8_4_ = (uint)bVar12 * (int)fVar168 | (uint)!bVar12 * auVar114._8_4_;
              local_240._12_4_ = (uint)bVar13 * (int)fVar169 | (uint)!bVar13 * auVar114._12_4_;
              local_240._16_4_ = (uint)bVar14 * (int)fVar127 | (uint)!bVar14 * auVar114._16_4_;
              local_240._20_4_ = (uint)bVar15 * (int)fVar129 | (uint)!bVar15 * auVar114._20_4_;
              local_240._24_4_ = (uint)bVar16 * (int)fVar130 | (uint)!bVar16 * auVar114._24_4_;
              local_240._28_4_ = (uint)bVar17 * auVar92._28_4_ | (uint)!bVar17 * auVar114._28_4_;
            }
          }
        }
        auVar194 = ZEXT3264(local_520);
        if (local_310 != 0) {
          auVar114 = vsubps_avx(ZEXT1632(auVar75),auVar97);
          auVar103 = auVar177._0_32_;
          auVar79 = vfmadd213ps_fma(auVar114,auVar103,auVar97);
          uVar133 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
          auVar97._4_4_ = uVar133;
          auVar97._0_4_ = uVar133;
          auVar97._8_4_ = uVar133;
          auVar97._12_4_ = uVar133;
          auVar97._16_4_ = uVar133;
          auVar97._20_4_ = uVar133;
          auVar97._24_4_ = uVar133;
          auVar97._28_4_ = uVar133;
          auVar114 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                        CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                                                 CONCAT44(auVar79._4_4_ +
                                                                          auVar79._4_4_,
                                                                          auVar79._0_4_ +
                                                                          auVar79._0_4_)))),auVar97)
          ;
          auVar146 = auVar147._0_32_;
          uVar141 = vcmpps_avx512vl(auVar146,auVar114,6);
          local_310 = local_310 & (byte)uVar141;
          if (local_310 != 0) {
            auVar138._8_4_ = 0xbf800000;
            auVar138._0_8_ = 0xbf800000bf800000;
            auVar138._12_4_ = 0xbf800000;
            auVar138._16_4_ = 0xbf800000;
            auVar138._20_4_ = 0xbf800000;
            auVar138._24_4_ = 0xbf800000;
            auVar138._28_4_ = 0xbf800000;
            auVar27._8_4_ = 0x40000000;
            auVar27._0_8_ = 0x4000000040000000;
            auVar27._12_4_ = 0x40000000;
            auVar27._16_4_ = 0x40000000;
            auVar27._20_4_ = 0x40000000;
            auVar27._24_4_ = 0x40000000;
            auVar27._28_4_ = 0x40000000;
            local_3a0 = vfmadd132ps_avx512vl(local_240,auVar138,auVar27);
            local_240 = local_3a0;
            auVar114 = local_240;
            local_360 = 0;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar66 = true, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar160 = 1.0 / (float)local_5d0._0_4_;
                local_300[0] = fVar160 * (auVar177._0_4_ + 0.0);
                local_300[1] = fVar160 * (auVar177._4_4_ + 1.0);
                local_300[2] = fVar160 * (auVar177._8_4_ + 2.0);
                local_300[3] = fVar160 * (auVar177._12_4_ + 3.0);
                fStack_2f0 = fVar160 * (auVar177._16_4_ + 4.0);
                fStack_2ec = fVar160 * (auVar177._20_4_ + 5.0);
                fStack_2e8 = fVar160 * (auVar177._24_4_ + 6.0);
                fStack_2e4 = auVar177._28_4_ + 7.0;
                local_240._0_8_ = local_3a0._0_8_;
                local_240._8_8_ = local_3a0._8_8_;
                local_240._16_8_ = local_3a0._16_8_;
                local_240._24_8_ = local_3a0._24_8_;
                local_2e0 = local_240._0_8_;
                uStack_2d8 = local_240._8_8_;
                uStack_2d0 = local_240._16_8_;
                uStack_2c8 = local_240._24_8_;
                local_2c0 = auVar146;
                lVar69 = 0;
                uVar67 = (ulong)local_310;
                for (uVar71 = uVar67; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000)
                {
                  lVar69 = lVar69 + 1;
                }
                _local_2a0 = vpbroadcastd_avx512vl();
                local_600 = vpbroadcastd_avx512vl();
                local_610 = (undefined4)local_5c0;
                uStack_60c = (undefined4)((ulong)local_5c0 >> 0x20);
                bVar66 = true;
                local_620 = local_560;
                uStack_618 = uStack_558;
                uStack_608 = uStack_5b8;
                local_5f0 = *pauVar3;
                local_3c0 = auVar103;
                local_380 = auVar146;
                local_35c = iVar9;
                local_350 = auVar81;
                local_340 = local_5b0;
                uStack_338 = uStack_5a8;
                local_330 = local_5c0;
                uStack_328 = uStack_5b8;
                local_320 = local_560;
                uStack_318 = uStack_558;
                local_240 = auVar114;
                do {
                  auVar75 = auVar196._0_16_;
                  local_480 = (float)uVar67;
                  fStack_47c = (float)(uVar67 >> 0x20);
                  uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar160 = local_300[lVar69];
                  local_420._4_4_ = fVar160;
                  local_420._0_4_ = fVar160;
                  local_420._8_4_ = fVar160;
                  local_420._12_4_ = fVar160;
                  local_280 = (uint)lVar69;
                  uStack_27c = (uint)((ulong)lVar69 >> 0x20);
                  local_410 = *(undefined4 *)((long)&local_2e0 + lVar69 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + lVar69 * 4);
                  local_660.context = context->user;
                  fVar167 = 1.0 - fVar160;
                  auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar160 * (fVar167 + fVar167))),
                                             ZEXT416((uint)fVar167),ZEXT416((uint)fVar167));
                  auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                            ZEXT416(0xc0a00000));
                  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * 3.0)),
                                            ZEXT416((uint)(fVar160 + fVar160)),auVar79);
                  auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                            ZEXT416(0x40000000));
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167 * -3.0)),
                                            ZEXT416((uint)(fVar167 + fVar167)),auVar79);
                  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),local_420,
                                            ZEXT416((uint)(fVar167 * -2.0)));
                  fVar160 = auVar19._0_4_ * 0.5;
                  fVar167 = auVar74._0_4_ * 0.5;
                  fVar168 = auVar79._0_4_ * 0.5;
                  fVar169 = auVar80._0_4_ * 0.5;
                  auVar154._0_4_ = fVar169 * (float)local_620;
                  auVar154._4_4_ = fVar169 * local_620._4_4_;
                  auVar154._8_4_ = fVar169 * (float)uStack_618;
                  auVar154._12_4_ = fVar169 * uStack_618._4_4_;
                  auVar171._4_4_ = fVar168;
                  auVar171._0_4_ = fVar168;
                  auVar171._8_4_ = fVar168;
                  auVar171._12_4_ = fVar168;
                  auVar59._4_4_ = uStack_60c;
                  auVar59._0_4_ = local_610;
                  auVar59._8_8_ = uStack_608;
                  auVar79 = vfmadd132ps_fma(auVar171,auVar154,auVar59);
                  auVar155._4_4_ = fVar167;
                  auVar155._0_4_ = fVar167;
                  auVar155._8_4_ = fVar167;
                  auVar155._12_4_ = fVar167;
                  auVar79 = vfmadd132ps_fma(auVar155,auVar79,local_5f0);
                  auVar136._4_4_ = fVar160;
                  auVar136._0_4_ = fVar160;
                  auVar136._8_4_ = fVar160;
                  auVar136._12_4_ = fVar160;
                  auVar79 = vfmadd213ps_fma(auVar136,auVar81,auVar79);
                  local_450 = auVar79._0_4_;
                  local_440 = vshufps_avx(auVar79,auVar79,0x55);
                  local_430 = vshufps_avx(auVar79,auVar79,0xaa);
                  local_400 = local_600._0_8_;
                  uStack_3f8 = local_600._8_8_;
                  local_3f0 = _local_2a0;
                  vpcmpeqd_avx2(ZEXT1632(_local_2a0),ZEXT1632(_local_2a0));
                  uStack_3dc = (local_660.context)->instID[0];
                  local_3e0 = uStack_3dc;
                  uStack_3d8 = uStack_3dc;
                  uStack_3d4 = uStack_3dc;
                  uStack_3d0 = (local_660.context)->instPrimID[0];
                  uStack_3cc = uStack_3d0;
                  uStack_3c8 = uStack_3d0;
                  uStack_3c4 = uStack_3d0;
                  local_680 = local_490._0_8_;
                  uStack_678 = local_490._8_8_;
                  local_660.valid = (int *)&local_680;
                  local_660.geometryUserPtr = pGVar10->userPtr;
                  local_660.hit = (RTCHitN *)&local_450;
                  local_660.N = 4;
                  local_5e0._0_4_ = uVar133;
                  local_660.ray = (RTCRayN *)ray;
                  uStack_44c = local_450;
                  uStack_448 = local_450;
                  uStack_444 = local_450;
                  uStack_40c = local_410;
                  uStack_408 = local_410;
                  uStack_404 = local_410;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->occlusionFilterN)(&local_660);
                    auVar189 = ZEXT1664(local_630);
                    auVar192 = ZEXT3264(local_5a0);
                    auVar193 = ZEXT3264(local_580);
                    auVar195 = ZEXT3264(local_4c0);
                    in_ZMM20 = ZEXT3264(local_500);
                    auVar79 = vxorps_avx512vl(auVar75,auVar75);
                    auVar196 = ZEXT1664(auVar79);
                    auVar194 = ZEXT3264(local_520);
                    uVar133 = local_5e0._0_4_;
                    uVar68 = local_540._0_4_;
                  }
                  auVar79 = auVar196._0_16_;
                  auVar55._8_8_ = uStack_678;
                  auVar55._0_8_ = local_680;
                  uVar71 = vptestmd_avx512vl(auVar55,auVar55);
                  if ((uVar71 & 0xf) == 0) {
                    uVar67 = CONCAT44(fStack_47c,local_480);
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_660);
                      auVar189 = ZEXT1664(local_630);
                      auVar192 = ZEXT3264(local_5a0);
                      auVar193 = ZEXT3264(local_580);
                      auVar195 = ZEXT3264(local_4c0);
                      in_ZMM20 = ZEXT3264(local_500);
                      auVar79 = vxorps_avx512vl(auVar79,auVar79);
                      auVar196 = ZEXT1664(auVar79);
                      auVar194 = ZEXT3264(local_520);
                      uVar68 = local_540._0_4_;
                      uVar133 = local_5e0._0_4_;
                    }
                    auVar56._8_8_ = uStack_678;
                    auVar56._0_8_ = local_680;
                    auVar79 = *(undefined1 (*) [16])(local_660.ray + 0x80);
                    uVar71 = vptestmd_avx512vl(auVar56,auVar56);
                    uVar71 = uVar71 & 0xf;
                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar12 = (bool)((byte)uVar71 & 1);
                    auVar85._0_4_ = (uint)bVar12 * auVar74._0_4_ | (uint)!bVar12 * auVar79._0_4_;
                    bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
                    auVar85._4_4_ = (uint)bVar12 * auVar74._4_4_ | (uint)!bVar12 * auVar79._4_4_;
                    bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
                    auVar85._8_4_ = (uint)bVar12 * auVar74._8_4_ | (uint)!bVar12 * auVar79._8_4_;
                    bVar12 = SUB81(uVar71 >> 3,0);
                    auVar85._12_4_ = (uint)bVar12 * auVar74._12_4_ | (uint)!bVar12 * auVar79._12_4_;
                    *(undefined1 (*) [16])(local_660.ray + 0x80) = auVar85;
                    uVar67 = CONCAT44(fStack_47c,local_480);
                    local_480 = auVar189._0_4_;
                    if ((byte)uVar71 != 0) break;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar133;
                  lVar69 = 0;
                  uVar67 = uVar67 ^ 1L << ((ulong)local_280 & 0x3f);
                  for (uVar71 = uVar67; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000
                      ) {
                    lVar69 = lVar69 + 1;
                  }
                  bVar66 = uVar67 != 0;
                  local_480 = auVar189._0_4_;
                } while (bVar66);
                auVar177 = ZEXT3264(auVar103);
                auVar147 = ZEXT3264(auVar146);
              }
              goto LAB_01b6519d;
            }
          }
        }
        bVar66 = false;
      }
LAB_01b6519d:
      local_520 = auVar194._0_32_;
      if (8 < iVar9) {
        local_540 = vpbroadcastd_avx512vl();
        local_280 = uVar68;
        uStack_27c = uVar68;
        uStack_278 = uVar68;
        uStack_274 = uVar68;
        uStack_270 = uVar68;
        uStack_26c = uVar68;
        uStack_268 = uVar68;
        uStack_264 = uVar68;
        local_2a0._4_4_ = 1.0 / (float)local_5d0._0_4_;
        local_2a0._0_4_ = local_2a0._4_4_;
        fStack_298 = (float)local_2a0._4_4_;
        fStack_294 = (float)local_2a0._4_4_;
        fStack_290 = (float)local_2a0._4_4_;
        fStack_28c = (float)local_2a0._4_4_;
        fStack_288 = (float)local_2a0._4_4_;
        fStack_284 = (float)local_2a0._4_4_;
        local_5d0 = vpbroadcastd_avx512vl();
        local_5e0 = vpbroadcastd_avx512vl();
        lVar69 = 8;
        auVar146 = auVar177._0_32_;
        auVar114 = auVar147._0_32_;
        fStack_47c = local_480;
        fStack_478 = local_480;
        fStack_474 = local_480;
        fStack_470 = local_480;
        fStack_46c = local_480;
        fStack_468 = local_480;
        fStack_464 = local_480;
        do {
          auVar103 = vpbroadcastd_avx512vl();
          auVar87 = vpor_avx2(auVar103,_DAT_0205a920);
          uVar22 = vpcmpd_avx512vl(auVar87,local_540,1);
          auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar69 * 4 + lVar23);
          auVar104 = *(undefined1 (*) [32])(lVar23 + 0x22307f0 + lVar69 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar23 + 0x2230c74 + lVar69 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar23 + 0x22310f8 + lVar69 * 4);
          auVar88 = vmulps_avx512vl(local_120,auVar101);
          auVar89 = vmulps_avx512vl(local_140,auVar101);
          auVar36._4_4_ = auVar101._4_4_ * (float)local_160._4_4_;
          auVar36._0_4_ = auVar101._0_4_ * (float)local_160._0_4_;
          auVar36._8_4_ = auVar101._8_4_ * fStack_158;
          auVar36._12_4_ = auVar101._12_4_ * fStack_154;
          auVar36._16_4_ = auVar101._16_4_ * fStack_150;
          auVar36._20_4_ = auVar101._20_4_ * fStack_14c;
          auVar36._24_4_ = auVar101._24_4_ * fStack_148;
          auVar36._28_4_ = auVar87._28_4_;
          auVar87 = vfmadd231ps_avx512vl(auVar88,auVar102,local_c0);
          auVar88 = vfmadd231ps_avx512vl(auVar89,auVar102,local_e0);
          auVar89 = vfmadd231ps_avx512vl(auVar36,auVar102,local_100);
          auVar99 = auVar192._0_32_;
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar104,auVar99);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar104,local_1e0);
          auVar79 = vfmadd231ps_fma(auVar89,auVar104,local_a0);
          auVar106 = auVar195._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar87,auVar103,auVar106);
          auVar105 = auVar193._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar88,auVar103,auVar105);
          auVar87 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar69 * 4 + lVar23);
          auVar88 = *(undefined1 (*) [32])(lVar23 + 0x2232c10 + lVar69 * 4);
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar103,local_80);
          auVar89 = *(undefined1 (*) [32])(lVar23 + 0x2233094 + lVar69 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar23 + 0x2233518 + lVar69 * 4);
          auVar90 = vmulps_avx512vl(local_120,auVar100);
          auVar91 = vmulps_avx512vl(local_140,auVar100);
          auVar37._4_4_ = auVar100._4_4_ * (float)local_160._4_4_;
          auVar37._0_4_ = auVar100._0_4_ * (float)local_160._0_4_;
          auVar37._8_4_ = auVar100._8_4_ * fStack_158;
          auVar37._12_4_ = auVar100._12_4_ * fStack_154;
          auVar37._16_4_ = auVar100._16_4_ * fStack_150;
          auVar37._20_4_ = auVar100._20_4_ * fStack_14c;
          auVar37._24_4_ = auVar100._24_4_ * fStack_148;
          auVar37._28_4_ = uStack_144;
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar89,local_c0);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,local_e0);
          auVar94 = vfmadd231ps_avx512vl(auVar37,auVar89,local_100);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar99);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,local_1e0);
          auVar74 = vfmadd231ps_fma(auVar94,auVar88,local_a0);
          auVar94 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar106);
          auVar95 = vfmadd231ps_avx512vl(auVar91,auVar87,auVar105);
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar87,local_80);
          auVar96 = vmaxps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar74));
          auVar90 = vsubps_avx(auVar94,auVar92);
          auVar91 = vsubps_avx(auVar95,auVar93);
          auVar97 = vmulps_avx512vl(auVar93,auVar90);
          auVar98 = vmulps_avx512vl(auVar92,auVar91);
          auVar97 = vsubps_avx512vl(auVar97,auVar98);
          auVar98 = vmulps_avx512vl(auVar91,auVar91);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar90,auVar90);
          auVar96 = vmulps_avx512vl(auVar96,auVar96);
          auVar96 = vmulps_avx512vl(auVar96,auVar98);
          auVar97 = vmulps_avx512vl(auVar97,auVar97);
          uVar141 = vcmpps_avx512vl(auVar97,auVar96,2);
          local_310 = (byte)uVar22 & (byte)uVar141;
          if (local_310 == 0) {
            auVar193 = ZEXT3264(auVar105);
            auVar192 = ZEXT3264(auVar99);
          }
          else {
            auVar100 = vmulps_avx512vl(local_4e0,auVar100);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_1c0,auVar100);
            auVar88 = vfmadd213ps_avx512vl(auVar88,local_1a0,auVar89);
            auVar87 = vfmadd213ps_avx512vl(auVar87,local_180,auVar88);
            auVar101 = vmulps_avx512vl(local_4e0,auVar101);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_1c0,auVar101);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_1a0,auVar102);
            auVar88 = vfmadd213ps_avx512vl(auVar103,local_180,auVar104);
            auVar103 = *(undefined1 (*) [32])(lVar23 + 0x223157c + lVar69 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar23 + 0x2231a00 + lVar69 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar23 + 0x2231e84 + lVar69 * 4);
            auVar101 = *(undefined1 (*) [32])(lVar23 + 0x2232308 + lVar69 * 4);
            auVar89 = vmulps_avx512vl(local_120,auVar101);
            auVar100 = vmulps_avx512vl(local_140,auVar101);
            auVar101 = vmulps_avx512vl(local_4e0,auVar101);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar102,local_c0);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_e0);
            auVar102 = vfmadd231ps_avx512vl(auVar101,local_1c0,auVar102);
            auVar101 = vfmadd231ps_avx512vl(auVar89,auVar104,auVar99);
            auVar89 = vfmadd231ps_avx512vl(auVar100,auVar104,local_1e0);
            auVar104 = vfmadd231ps_avx512vl(auVar102,local_1a0,auVar104);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar106);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,auVar105);
            auVar100 = vfmadd231ps_avx512vl(auVar104,local_180,auVar103);
            auVar103 = *(undefined1 (*) [32])(lVar23 + 0x223399c + lVar69 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar23 + 0x22342a4 + lVar69 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar23 + 0x2234728 + lVar69 * 4);
            auVar96 = vmulps_avx512vl(local_120,auVar102);
            auVar97 = vmulps_avx512vl(local_140,auVar102);
            auVar102 = vmulps_avx512vl(local_4e0,auVar102);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar104,local_c0);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar104,local_e0);
            auVar102 = vfmadd231ps_avx512vl(auVar102,local_1c0,auVar104);
            auVar104 = *(undefined1 (*) [32])(lVar23 + 0x2233e20 + lVar69 * 4);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar104,auVar99);
            auVar80 = vfmadd231ps_fma(auVar97,auVar104,local_1e0);
            auVar104 = vfmadd231ps_avx512vl(auVar102,local_1a0,auVar104);
            auVar102 = vfmadd231ps_avx512vl(auVar96,auVar103,auVar106);
            auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar103,auVar105);
            auVar104 = vfmadd231ps_avx512vl(auVar104,local_180,auVar103);
            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar101,auVar97);
            vandps_avx512vl(auVar89,auVar97);
            auVar103 = vmaxps_avx(auVar97,auVar97);
            vandps_avx512vl(auVar100,auVar97);
            auVar103 = vmaxps_avx(auVar103,auVar97);
            auVar60._4_4_ = fStack_47c;
            auVar60._0_4_ = local_480;
            auVar60._8_4_ = fStack_478;
            auVar60._12_4_ = fStack_474;
            auVar60._16_4_ = fStack_470;
            auVar60._20_4_ = fStack_46c;
            auVar60._24_4_ = fStack_468;
            auVar60._28_4_ = fStack_464;
            uVar71 = vcmpps_avx512vl(auVar103,auVar60,1);
            bVar12 = (bool)((byte)uVar71 & 1);
            auVar115._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar101._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar101._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar101._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar101._12_4_);
            bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar115._16_4_ =
                 (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar101._16_4_);
            bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar115._20_4_ =
                 (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar101._20_4_);
            bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar115._24_4_ =
                 (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar101._24_4_);
            bVar12 = SUB81(uVar71 >> 7,0);
            auVar115._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar101._28_4_;
            bVar12 = (bool)((byte)uVar71 & 1);
            auVar116._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar89._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar89._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar89._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar89._12_4_);
            bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar12 * auVar91._16_4_ | (uint)!bVar12 * auVar89._16_4_);
            bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar12 * auVar91._20_4_ | (uint)!bVar12 * auVar89._20_4_);
            bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar12 * auVar91._24_4_ | (uint)!bVar12 * auVar89._24_4_);
            bVar12 = SUB81(uVar71 >> 7,0);
            auVar116._28_4_ = (uint)bVar12 * auVar91._28_4_ | (uint)!bVar12 * auVar89._28_4_;
            vandps_avx512vl(auVar102,auVar97);
            vandps_avx512vl(auVar96,auVar97);
            auVar103 = vmaxps_avx(auVar116,auVar116);
            vandps_avx512vl(auVar104,auVar97);
            auVar103 = vmaxps_avx(auVar103,auVar116);
            uVar71 = vcmpps_avx512vl(auVar103,auVar60,1);
            bVar12 = (bool)((byte)uVar71 & 1);
            auVar117._0_4_ = (uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar102._0_4_;
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar117._4_4_ = (uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar102._4_4_;
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar117._8_4_ = (uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar102._8_4_;
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar117._12_4_ = (uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar102._12_4_;
            bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar117._16_4_ = (uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar102._16_4_;
            bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar117._20_4_ = (uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar102._20_4_;
            bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar117._24_4_ = (uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar102._24_4_;
            bVar12 = SUB81(uVar71 >> 7,0);
            auVar117._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar102._28_4_;
            bVar12 = (bool)((byte)uVar71 & 1);
            auVar118._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar96._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar96._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar96._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar96._12_4_);
            bVar12 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar12 * auVar91._16_4_ | (uint)!bVar12 * auVar96._16_4_);
            bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar12 * auVar91._20_4_ | (uint)!bVar12 * auVar96._20_4_);
            bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar12 * auVar91._24_4_ | (uint)!bVar12 * auVar96._24_4_);
            bVar12 = SUB81(uVar71 >> 7,0);
            auVar118._28_4_ = (uint)bVar12 * auVar91._28_4_ | (uint)!bVar12 * auVar96._28_4_;
            auVar184._8_4_ = 0x80000000;
            auVar184._0_8_ = 0x8000000080000000;
            auVar184._12_4_ = 0x80000000;
            auVar184._16_4_ = 0x80000000;
            auVar184._20_4_ = 0x80000000;
            auVar184._24_4_ = 0x80000000;
            auVar184._28_4_ = 0x80000000;
            auVar103 = vxorps_avx512vl(auVar117,auVar184);
            auVar96 = auVar196._0_32_;
            auVar104 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar96);
            auVar80 = vfmadd231ps_fma(auVar104,auVar116,auVar116);
            auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
            auVar191._8_4_ = 0xbf000000;
            auVar191._0_8_ = 0xbf000000bf000000;
            auVar191._12_4_ = 0xbf000000;
            auVar191._16_4_ = 0xbf000000;
            auVar191._20_4_ = 0xbf000000;
            auVar191._24_4_ = 0xbf000000;
            auVar191._28_4_ = 0xbf000000;
            fVar160 = auVar104._0_4_;
            fVar167 = auVar104._4_4_;
            fVar168 = auVar104._8_4_;
            fVar169 = auVar104._12_4_;
            fVar148 = auVar104._16_4_;
            fVar159 = auVar104._20_4_;
            fVar72 = auVar104._24_4_;
            auVar38._4_4_ = fVar167 * fVar167 * fVar167 * auVar80._4_4_ * -0.5;
            auVar38._0_4_ = fVar160 * fVar160 * fVar160 * auVar80._0_4_ * -0.5;
            auVar38._8_4_ = fVar168 * fVar168 * fVar168 * auVar80._8_4_ * -0.5;
            auVar38._12_4_ = fVar169 * fVar169 * fVar169 * auVar80._12_4_ * -0.5;
            auVar38._16_4_ = fVar148 * fVar148 * fVar148 * -0.0;
            auVar38._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
            auVar38._24_4_ = fVar72 * fVar72 * fVar72 * -0.0;
            auVar38._28_4_ = auVar116._28_4_;
            auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar104 = vfmadd231ps_avx512vl(auVar38,auVar102,auVar104);
            auVar39._4_4_ = auVar116._4_4_ * auVar104._4_4_;
            auVar39._0_4_ = auVar116._0_4_ * auVar104._0_4_;
            auVar39._8_4_ = auVar116._8_4_ * auVar104._8_4_;
            auVar39._12_4_ = auVar116._12_4_ * auVar104._12_4_;
            auVar39._16_4_ = auVar116._16_4_ * auVar104._16_4_;
            auVar39._20_4_ = auVar116._20_4_ * auVar104._20_4_;
            auVar39._24_4_ = auVar116._24_4_ * auVar104._24_4_;
            auVar39._28_4_ = 0;
            auVar40._4_4_ = auVar104._4_4_ * -auVar115._4_4_;
            auVar40._0_4_ = auVar104._0_4_ * -auVar115._0_4_;
            auVar40._8_4_ = auVar104._8_4_ * -auVar115._8_4_;
            auVar40._12_4_ = auVar104._12_4_ * -auVar115._12_4_;
            auVar40._16_4_ = auVar104._16_4_ * -auVar115._16_4_;
            auVar40._20_4_ = auVar104._20_4_ * -auVar115._20_4_;
            auVar40._24_4_ = auVar104._24_4_ * -auVar115._24_4_;
            auVar40._28_4_ = auVar116._28_4_;
            auVar101 = vmulps_avx512vl(auVar104,auVar96);
            auVar104 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar96);
            auVar104 = vfmadd231ps_avx512vl(auVar104,auVar118,auVar118);
            auVar89 = vrsqrt14ps_avx512vl(auVar104);
            auVar104 = vmulps_avx512vl(auVar104,auVar191);
            fVar160 = auVar89._0_4_;
            fVar167 = auVar89._4_4_;
            fVar168 = auVar89._8_4_;
            fVar169 = auVar89._12_4_;
            fVar148 = auVar89._16_4_;
            fVar159 = auVar89._20_4_;
            fVar72 = auVar89._24_4_;
            auVar41._4_4_ = fVar167 * fVar167 * fVar167 * auVar104._4_4_;
            auVar41._0_4_ = fVar160 * fVar160 * fVar160 * auVar104._0_4_;
            auVar41._8_4_ = fVar168 * fVar168 * fVar168 * auVar104._8_4_;
            auVar41._12_4_ = fVar169 * fVar169 * fVar169 * auVar104._12_4_;
            auVar41._16_4_ = fVar148 * fVar148 * fVar148 * auVar104._16_4_;
            auVar41._20_4_ = fVar159 * fVar159 * fVar159 * auVar104._20_4_;
            auVar41._24_4_ = fVar72 * fVar72 * fVar72 * auVar104._24_4_;
            auVar41._28_4_ = auVar104._28_4_;
            auVar104 = vfmadd231ps_avx512vl(auVar41,auVar102,auVar89);
            auVar42._4_4_ = auVar118._4_4_ * auVar104._4_4_;
            auVar42._0_4_ = auVar118._0_4_ * auVar104._0_4_;
            auVar42._8_4_ = auVar118._8_4_ * auVar104._8_4_;
            auVar42._12_4_ = auVar118._12_4_ * auVar104._12_4_;
            auVar42._16_4_ = auVar118._16_4_ * auVar104._16_4_;
            auVar42._20_4_ = auVar118._20_4_ * auVar104._20_4_;
            auVar42._24_4_ = auVar118._24_4_ * auVar104._24_4_;
            auVar42._28_4_ = auVar89._28_4_;
            auVar43._4_4_ = auVar104._4_4_ * auVar103._4_4_;
            auVar43._0_4_ = auVar104._0_4_ * auVar103._0_4_;
            auVar43._8_4_ = auVar104._8_4_ * auVar103._8_4_;
            auVar43._12_4_ = auVar104._12_4_ * auVar103._12_4_;
            auVar43._16_4_ = auVar104._16_4_ * auVar103._16_4_;
            auVar43._20_4_ = auVar104._20_4_ * auVar103._20_4_;
            auVar43._24_4_ = auVar104._24_4_ * auVar103._24_4_;
            auVar43._28_4_ = auVar103._28_4_;
            auVar103 = vmulps_avx512vl(auVar104,auVar96);
            auVar80 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar79),auVar92);
            auVar104 = ZEXT1632(auVar79);
            auVar19 = vfmadd213ps_fma(auVar40,auVar104,auVar93);
            auVar102 = vfmadd213ps_avx512vl(auVar101,auVar104,auVar88);
            auVar89 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar74),auVar94);
            auVar21 = vfnmadd213ps_fma(auVar39,auVar104,auVar92);
            auVar100 = ZEXT1632(auVar74);
            auVar75 = vfmadd213ps_fma(auVar43,auVar100,auVar95);
            auVar83 = vfnmadd213ps_fma(auVar40,auVar104,auVar93);
            auVar82 = vfmadd213ps_fma(auVar103,auVar100,auVar87);
            auVar93 = ZEXT1632(auVar79);
            auVar84 = vfnmadd231ps_fma(auVar88,auVar93,auVar101);
            auVar78 = vfnmadd213ps_fma(auVar42,auVar100,auVar94);
            auVar77 = vfnmadd213ps_fma(auVar43,auVar100,auVar95);
            auVar134 = vfnmadd231ps_fma(auVar87,ZEXT1632(auVar74),auVar103);
            auVar87 = vsubps_avx512vl(auVar89,ZEXT1632(auVar21));
            auVar103 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar83));
            auVar104 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar84));
            auVar44._4_4_ = auVar103._4_4_ * auVar84._4_4_;
            auVar44._0_4_ = auVar103._0_4_ * auVar84._0_4_;
            auVar44._8_4_ = auVar103._8_4_ * auVar84._8_4_;
            auVar44._12_4_ = auVar103._12_4_ * auVar84._12_4_;
            auVar44._16_4_ = auVar103._16_4_ * 0.0;
            auVar44._20_4_ = auVar103._20_4_ * 0.0;
            auVar44._24_4_ = auVar103._24_4_ * 0.0;
            auVar44._28_4_ = auVar101._28_4_;
            auVar79 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar83),auVar104);
            auVar45._4_4_ = auVar104._4_4_ * auVar21._4_4_;
            auVar45._0_4_ = auVar104._0_4_ * auVar21._0_4_;
            auVar45._8_4_ = auVar104._8_4_ * auVar21._8_4_;
            auVar45._12_4_ = auVar104._12_4_ * auVar21._12_4_;
            auVar45._16_4_ = auVar104._16_4_ * 0.0;
            auVar45._20_4_ = auVar104._20_4_ * 0.0;
            auVar45._24_4_ = auVar104._24_4_ * 0.0;
            auVar45._28_4_ = auVar104._28_4_;
            auVar20 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar84),auVar87);
            auVar46._4_4_ = auVar83._4_4_ * auVar87._4_4_;
            auVar46._0_4_ = auVar83._0_4_ * auVar87._0_4_;
            auVar46._8_4_ = auVar83._8_4_ * auVar87._8_4_;
            auVar46._12_4_ = auVar83._12_4_ * auVar87._12_4_;
            auVar46._16_4_ = auVar87._16_4_ * 0.0;
            auVar46._20_4_ = auVar87._20_4_ * 0.0;
            auVar46._24_4_ = auVar87._24_4_ * 0.0;
            auVar46._28_4_ = auVar87._28_4_;
            auVar76 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar21),auVar103);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar96,ZEXT1632(auVar20));
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,ZEXT1632(auVar79));
            uVar71 = vcmpps_avx512vl(auVar103,auVar96,2);
            bVar64 = (byte)uVar71;
            fVar125 = (float)((uint)(bVar64 & 1) * auVar80._0_4_ |
                             (uint)!(bool)(bVar64 & 1) * auVar78._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            fVar127 = (float)((uint)bVar12 * auVar80._4_4_ | (uint)!bVar12 * auVar78._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            fVar130 = (float)((uint)bVar12 * auVar80._8_4_ | (uint)!bVar12 * auVar78._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            fVar131 = (float)((uint)bVar12 * auVar80._12_4_ | (uint)!bVar12 * auVar78._12_4_);
            auVar100 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar130,CONCAT44(fVar127,fVar125))));
            fVar126 = (float)((uint)(bVar64 & 1) * auVar19._0_4_ |
                             (uint)!(bool)(bVar64 & 1) * auVar77._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            fVar129 = (float)((uint)bVar12 * auVar19._4_4_ | (uint)!bVar12 * auVar77._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            fVar128 = (float)((uint)bVar12 * auVar19._8_4_ | (uint)!bVar12 * auVar77._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            fVar132 = (float)((uint)bVar12 * auVar19._12_4_ | (uint)!bVar12 * auVar77._12_4_);
            auVar90 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar128,CONCAT44(fVar129,fVar126))));
            auVar119._0_4_ =
                 (float)((uint)(bVar64 & 1) * auVar102._0_4_ |
                        (uint)!(bool)(bVar64 & 1) * auVar134._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar134._4_4_)
            ;
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar134._8_4_)
            ;
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar134._12_4_);
            fVar160 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar102._16_4_);
            auVar119._16_4_ = fVar160;
            fVar168 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar102._20_4_);
            auVar119._20_4_ = fVar168;
            fVar167 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar102._24_4_);
            auVar119._24_4_ = fVar167;
            iVar1 = (uint)(byte)(uVar71 >> 7) * auVar102._28_4_;
            auVar119._28_4_ = iVar1;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar21),auVar89);
            auVar120._0_4_ =
                 (uint)(bVar64 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar79._0_4_;
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar120._4_4_ = (uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar79._4_4_;
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar120._8_4_ = (uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar79._8_4_;
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar120._12_4_ = (uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar79._12_4_;
            auVar120._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar103._16_4_;
            auVar120._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar103._20_4_;
            auVar120._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar103._24_4_;
            auVar120._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar103._28_4_;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar75));
            auVar121._0_4_ =
                 (float)((uint)(bVar64 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar64 & 1) * auVar80._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar80._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar80._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar80._12_4_);
            fVar159 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar103._16_4_);
            auVar121._16_4_ = fVar159;
            fVar148 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar103._20_4_);
            auVar121._20_4_ = fVar148;
            fVar169 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar103._24_4_);
            auVar121._24_4_ = fVar169;
            auVar121._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar103._28_4_;
            auVar103 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar82));
            auVar122._0_4_ =
                 (float)((uint)(bVar64 & 1) * auVar103._0_4_ |
                        (uint)!(bool)(bVar64 & 1) * auVar19._0_4_);
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar19._4_4_);
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar19._8_4_);
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar19._12_4_);
            fVar73 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar103._16_4_);
            auVar122._16_4_ = fVar73;
            fVar124 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar103._20_4_);
            auVar122._20_4_ = fVar124;
            fVar72 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar103._24_4_);
            auVar122._24_4_ = fVar72;
            iVar2 = (uint)(byte)(uVar71 >> 7) * auVar103._28_4_;
            auVar122._28_4_ = iVar2;
            auVar123._0_4_ =
                 (uint)(bVar64 & 1) * (int)auVar21._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar89._0_4_
            ;
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar123._4_4_ = (uint)bVar12 * (int)auVar21._4_4_ | (uint)!bVar12 * auVar89._4_4_;
            bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar123._8_4_ = (uint)bVar12 * (int)auVar21._8_4_ | (uint)!bVar12 * auVar89._8_4_;
            bVar12 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar123._12_4_ = (uint)bVar12 * (int)auVar21._12_4_ | (uint)!bVar12 * auVar89._12_4_;
            auVar123._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar89._16_4_;
            auVar123._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar89._20_4_;
            auVar123._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar89._24_4_;
            auVar123._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar89._28_4_;
            bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar71 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar89 = vsubps_avx512vl(auVar123,auVar100);
            auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar83._12_4_ |
                                                     (uint)!bVar16 * auVar75._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar83._8_4_ |
                                                              (uint)!bVar14 * auVar75._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar83._4_4_ |
                                                                       (uint)!bVar12 * auVar75._4_4_
                                                                       ,(uint)(bVar64 & 1) *
                                                                        (int)auVar83._0_4_ |
                                                                        (uint)!(bool)(bVar64 & 1) *
                                                                        auVar75._0_4_)))),auVar90);
            auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar84._12_4_ |
                                                     (uint)!bVar17 * auVar82._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar84._8_4_ |
                                                              (uint)!bVar15 * auVar82._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar84._4_4_ |
                                                                       (uint)!bVar13 * auVar82._4_4_
                                                                       ,(uint)(bVar64 & 1) *
                                                                        (int)auVar84._0_4_ |
                                                                        (uint)!(bool)(bVar64 & 1) *
                                                                        auVar82._0_4_)))),auVar119);
            auVar101 = vsubps_avx(auVar100,auVar120);
            auVar87 = vsubps_avx(auVar90,auVar121);
            auVar88 = vsubps_avx(auVar119,auVar122);
            auVar47._4_4_ = auVar102._4_4_ * fVar127;
            auVar47._0_4_ = auVar102._0_4_ * fVar125;
            auVar47._8_4_ = auVar102._8_4_ * fVar130;
            auVar47._12_4_ = auVar102._12_4_ * fVar131;
            auVar47._16_4_ = auVar102._16_4_ * 0.0;
            auVar47._20_4_ = auVar102._20_4_ * 0.0;
            auVar47._24_4_ = auVar102._24_4_ * 0.0;
            auVar47._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar47,auVar119,auVar89);
            auVar158._0_4_ = fVar126 * auVar89._0_4_;
            auVar158._4_4_ = fVar129 * auVar89._4_4_;
            auVar158._8_4_ = fVar128 * auVar89._8_4_;
            auVar158._12_4_ = fVar132 * auVar89._12_4_;
            auVar158._16_4_ = auVar89._16_4_ * 0.0;
            auVar158._20_4_ = auVar89._20_4_ * 0.0;
            auVar158._24_4_ = auVar89._24_4_ * 0.0;
            auVar158._28_4_ = 0;
            auVar80 = vfmsub231ps_fma(auVar158,auVar100,auVar104);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar96,ZEXT1632(auVar79));
            auVar165._0_4_ = auVar104._0_4_ * auVar119._0_4_;
            auVar165._4_4_ = auVar104._4_4_ * auVar119._4_4_;
            auVar165._8_4_ = auVar104._8_4_ * auVar119._8_4_;
            auVar165._12_4_ = auVar104._12_4_ * auVar119._12_4_;
            auVar165._16_4_ = auVar104._16_4_ * fVar160;
            auVar165._20_4_ = auVar104._20_4_ * fVar168;
            auVar165._24_4_ = auVar104._24_4_ * fVar167;
            auVar165._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar165,auVar90,auVar102);
            auVar91 = vfmadd231ps_avx512vl(auVar103,auVar96,ZEXT1632(auVar79));
            auVar103 = vmulps_avx512vl(auVar88,auVar120);
            auVar103 = vfmsub231ps_avx512vl(auVar103,auVar101,auVar122);
            auVar48._4_4_ = auVar87._4_4_ * auVar122._4_4_;
            auVar48._0_4_ = auVar87._0_4_ * auVar122._0_4_;
            auVar48._8_4_ = auVar87._8_4_ * auVar122._8_4_;
            auVar48._12_4_ = auVar87._12_4_ * auVar122._12_4_;
            auVar48._16_4_ = auVar87._16_4_ * fVar73;
            auVar48._20_4_ = auVar87._20_4_ * fVar124;
            auVar48._24_4_ = auVar87._24_4_ * fVar72;
            auVar48._28_4_ = iVar2;
            auVar79 = vfmsub231ps_fma(auVar48,auVar121,auVar88);
            auVar166._0_4_ = auVar121._0_4_ * auVar101._0_4_;
            auVar166._4_4_ = auVar121._4_4_ * auVar101._4_4_;
            auVar166._8_4_ = auVar121._8_4_ * auVar101._8_4_;
            auVar166._12_4_ = auVar121._12_4_ * auVar101._12_4_;
            auVar166._16_4_ = fVar159 * auVar101._16_4_;
            auVar166._20_4_ = fVar148 * auVar101._20_4_;
            auVar166._24_4_ = fVar169 * auVar101._24_4_;
            auVar166._28_4_ = 0;
            auVar80 = vfmsub231ps_fma(auVar166,auVar87,auVar120);
            auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar96,auVar103);
            auVar92 = vfmadd231ps_avx512vl(auVar103,auVar96,ZEXT1632(auVar79));
            auVar103 = vmaxps_avx(auVar91,auVar92);
            uVar141 = vcmpps_avx512vl(auVar103,auVar96,2);
            local_310 = local_310 & (byte)uVar141;
            if (local_310 == 0) {
LAB_01b65de7:
              local_310 = 0;
            }
            else {
              auVar49._4_4_ = auVar88._4_4_ * auVar104._4_4_;
              auVar49._0_4_ = auVar88._0_4_ * auVar104._0_4_;
              auVar49._8_4_ = auVar88._8_4_ * auVar104._8_4_;
              auVar49._12_4_ = auVar88._12_4_ * auVar104._12_4_;
              auVar49._16_4_ = auVar88._16_4_ * auVar104._16_4_;
              auVar49._20_4_ = auVar88._20_4_ * auVar104._20_4_;
              auVar49._24_4_ = auVar88._24_4_ * auVar104._24_4_;
              auVar49._28_4_ = auVar103._28_4_;
              auVar19 = vfmsub231ps_fma(auVar49,auVar87,auVar102);
              auVar50._4_4_ = auVar102._4_4_ * auVar101._4_4_;
              auVar50._0_4_ = auVar102._0_4_ * auVar101._0_4_;
              auVar50._8_4_ = auVar102._8_4_ * auVar101._8_4_;
              auVar50._12_4_ = auVar102._12_4_ * auVar101._12_4_;
              auVar50._16_4_ = auVar102._16_4_ * auVar101._16_4_;
              auVar50._20_4_ = auVar102._20_4_ * auVar101._20_4_;
              auVar50._24_4_ = auVar102._24_4_ * auVar101._24_4_;
              auVar50._28_4_ = auVar102._28_4_;
              auVar80 = vfmsub231ps_fma(auVar50,auVar89,auVar88);
              auVar51._4_4_ = auVar87._4_4_ * auVar89._4_4_;
              auVar51._0_4_ = auVar87._0_4_ * auVar89._0_4_;
              auVar51._8_4_ = auVar87._8_4_ * auVar89._8_4_;
              auVar51._12_4_ = auVar87._12_4_ * auVar89._12_4_;
              auVar51._16_4_ = auVar87._16_4_ * auVar89._16_4_;
              auVar51._20_4_ = auVar87._20_4_ * auVar89._20_4_;
              auVar51._24_4_ = auVar87._24_4_ * auVar89._24_4_;
              auVar51._28_4_ = auVar87._28_4_;
              auVar75 = vfmsub231ps_fma(auVar51,auVar101,auVar104);
              auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar80),ZEXT1632(auVar75));
              auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar19),auVar96);
              auVar104 = vrcp14ps_avx512vl(auVar103);
              auVar28._8_4_ = 0x3f800000;
              auVar28._0_8_ = &DAT_3f8000003f800000;
              auVar28._12_4_ = 0x3f800000;
              auVar28._16_4_ = 0x3f800000;
              auVar28._20_4_ = 0x3f800000;
              auVar28._24_4_ = 0x3f800000;
              auVar28._28_4_ = 0x3f800000;
              auVar102 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar28);
              auVar79 = vfmadd132ps_fma(auVar102,auVar104,auVar104);
              auVar52._4_4_ = auVar75._4_4_ * auVar119._4_4_;
              auVar52._0_4_ = auVar75._0_4_ * auVar119._0_4_;
              auVar52._8_4_ = auVar75._8_4_ * auVar119._8_4_;
              auVar52._12_4_ = auVar75._12_4_ * auVar119._12_4_;
              auVar52._16_4_ = fVar160 * 0.0;
              auVar52._20_4_ = fVar168 * 0.0;
              auVar52._24_4_ = fVar167 * 0.0;
              auVar52._28_4_ = iVar1;
              auVar80 = vfmadd231ps_fma(auVar52,auVar90,ZEXT1632(auVar80));
              auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar100,ZEXT1632(auVar19));
              fVar160 = auVar79._0_4_;
              fVar167 = auVar79._4_4_;
              fVar168 = auVar79._8_4_;
              fVar169 = auVar79._12_4_;
              auVar104 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar169,
                                            CONCAT48(auVar80._8_4_ * fVar168,
                                                     CONCAT44(auVar80._4_4_ * fVar167,
                                                              auVar80._0_4_ * fVar160))));
              auVar61._4_4_ = uStack_27c;
              auVar61._0_4_ = local_280;
              auVar61._8_4_ = uStack_278;
              auVar61._12_4_ = uStack_274;
              auVar61._16_4_ = uStack_270;
              auVar61._20_4_ = uStack_26c;
              auVar61._24_4_ = uStack_268;
              auVar61._28_4_ = uStack_264;
              uVar141 = vcmpps_avx512vl(auVar104,auVar61,0xd);
              uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar29._4_4_ = uVar133;
              auVar29._0_4_ = uVar133;
              auVar29._8_4_ = uVar133;
              auVar29._12_4_ = uVar133;
              auVar29._16_4_ = uVar133;
              auVar29._20_4_ = uVar133;
              auVar29._24_4_ = uVar133;
              auVar29._28_4_ = uVar133;
              uVar22 = vcmpps_avx512vl(auVar104,auVar29,2);
              local_310 = (byte)uVar141 & (byte)uVar22 & local_310;
              if (local_310 == 0) goto LAB_01b65de7;
              uVar141 = vcmpps_avx512vl(auVar103,auVar96,4);
              if ((local_310 & (byte)uVar141) == 0) {
                local_310 = 0;
              }
              else {
                local_310 = local_310 & (byte)uVar141;
                fVar148 = auVar91._0_4_ * fVar160;
                fVar159 = auVar91._4_4_ * fVar167;
                auVar53._4_4_ = fVar159;
                auVar53._0_4_ = fVar148;
                fVar72 = auVar91._8_4_ * fVar168;
                auVar53._8_4_ = fVar72;
                fVar73 = auVar91._12_4_ * fVar169;
                auVar53._12_4_ = fVar73;
                fVar124 = auVar91._16_4_ * 0.0;
                auVar53._16_4_ = fVar124;
                fVar125 = auVar91._20_4_ * 0.0;
                auVar53._20_4_ = fVar125;
                fVar126 = auVar91._24_4_ * 0.0;
                auVar53._24_4_ = fVar126;
                auVar53._28_4_ = auVar91._28_4_;
                fVar160 = auVar92._0_4_ * fVar160;
                fVar167 = auVar92._4_4_ * fVar167;
                auVar54._4_4_ = fVar167;
                auVar54._0_4_ = fVar160;
                fVar168 = auVar92._8_4_ * fVar168;
                auVar54._8_4_ = fVar168;
                fVar169 = auVar92._12_4_ * fVar169;
                auVar54._12_4_ = fVar169;
                fVar127 = auVar92._16_4_ * 0.0;
                auVar54._16_4_ = fVar127;
                fVar129 = auVar92._20_4_ * 0.0;
                auVar54._20_4_ = fVar129;
                fVar130 = auVar92._24_4_ * 0.0;
                auVar54._24_4_ = fVar130;
                auVar54._28_4_ = auVar92._28_4_;
                auVar174._8_4_ = 0x3f800000;
                auVar174._0_8_ = &DAT_3f8000003f800000;
                auVar174._12_4_ = 0x3f800000;
                auVar174._16_4_ = 0x3f800000;
                auVar174._20_4_ = 0x3f800000;
                auVar174._24_4_ = 0x3f800000;
                auVar174._28_4_ = 0x3f800000;
                auVar103 = vsubps_avx512vl(auVar174,auVar53);
                bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar71 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar71 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar71 >> 6) & 1);
                bVar18 = SUB81(uVar71 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar18 * auVar91._28_4_ |
                                              (uint)!bVar18 * auVar103._28_4_,
                                              CONCAT424((uint)bVar17 * (int)fVar126 |
                                                        (uint)!bVar17 * auVar103._24_4_,
                                                        CONCAT420((uint)bVar16 * (int)fVar125 |
                                                                  (uint)!bVar16 * auVar103._20_4_,
                                                                  CONCAT416((uint)bVar15 *
                                                                            (int)fVar124 |
                                                                            (uint)!bVar15 *
                                                                            auVar103._16_4_,
                                                                            CONCAT412((uint)bVar14 *
                                                                                      (int)fVar73 |
                                                                                      (uint)!bVar14
                                                                                      * auVar103.
                                                  _12_4_,CONCAT48((uint)bVar13 * (int)fVar72 |
                                                                  (uint)!bVar13 * auVar103._8_4_,
                                                                  CONCAT44((uint)bVar12 *
                                                                           (int)fVar159 |
                                                                           (uint)!bVar12 *
                                                                           auVar103._4_4_,
                                                                           (uint)(bVar64 & 1) *
                                                                           (int)fVar148 |
                                                                           (uint)!(bool)(bVar64 & 1)
                                                                           * auVar103._0_4_))))))));
                auVar103 = vsubps_avx(auVar174,auVar54);
                bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
                bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
                bVar15 = (bool)((byte)(uVar71 >> 4) & 1);
                bVar16 = (bool)((byte)(uVar71 >> 5) & 1);
                bVar17 = (bool)((byte)(uVar71 >> 6) & 1);
                bVar18 = SUB81(uVar71 >> 7,0);
                local_260._4_4_ = (uint)bVar12 * (int)fVar167 | (uint)!bVar12 * auVar103._4_4_;
                local_260._0_4_ =
                     (uint)(bVar64 & 1) * (int)fVar160 | (uint)!(bool)(bVar64 & 1) * auVar103._0_4_;
                local_260._8_4_ = (uint)bVar13 * (int)fVar168 | (uint)!bVar13 * auVar103._8_4_;
                local_260._12_4_ = (uint)bVar14 * (int)fVar169 | (uint)!bVar14 * auVar103._12_4_;
                local_260._16_4_ = (uint)bVar15 * (int)fVar127 | (uint)!bVar15 * auVar103._16_4_;
                local_260._20_4_ = (uint)bVar16 * (int)fVar129 | (uint)!bVar16 * auVar103._20_4_;
                local_260._24_4_ = (uint)bVar17 * (int)fVar130 | (uint)!bVar17 * auVar103._24_4_;
                local_260._28_4_ = (uint)bVar18 * auVar92._28_4_ | (uint)!bVar18 * auVar103._28_4_;
                auVar194 = ZEXT3264(auVar104);
              }
            }
            auVar193 = ZEXT3264(local_580);
            auVar192 = ZEXT3264(local_5a0);
            if (local_310 != 0) {
              auVar103 = vsubps_avx(ZEXT1632(auVar74),auVar93);
              local_500 = in_ZMM20._0_32_;
              auVar103 = vfmadd213ps_avx512vl(auVar103,local_500,auVar93);
              auVar139._0_4_ = auVar103._0_4_ + auVar103._0_4_;
              auVar139._4_4_ = auVar103._4_4_ + auVar103._4_4_;
              auVar139._8_4_ = auVar103._8_4_ + auVar103._8_4_;
              auVar139._12_4_ = auVar103._12_4_ + auVar103._12_4_;
              auVar139._16_4_ = auVar103._16_4_ + auVar103._16_4_;
              auVar139._20_4_ = auVar103._20_4_ + auVar103._20_4_;
              auVar139._24_4_ = auVar103._24_4_ + auVar103._24_4_;
              auVar139._28_4_ = auVar103._28_4_ + auVar103._28_4_;
              uVar133 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
              auVar30._4_4_ = uVar133;
              auVar30._0_4_ = uVar133;
              auVar30._8_4_ = uVar133;
              auVar30._12_4_ = uVar133;
              auVar30._16_4_ = uVar133;
              auVar30._20_4_ = uVar133;
              auVar30._24_4_ = uVar133;
              auVar30._28_4_ = uVar133;
              auVar103 = vmulps_avx512vl(auVar139,auVar30);
              local_520 = auVar194._0_32_;
              uVar141 = vcmpps_avx512vl(local_520,auVar103,6);
              local_310 = local_310 & (byte)uVar141;
              if (local_310 != 0) {
                auVar140._8_4_ = 0xbf800000;
                auVar140._0_8_ = 0xbf800000bf800000;
                auVar140._12_4_ = 0xbf800000;
                auVar140._16_4_ = 0xbf800000;
                auVar140._20_4_ = 0xbf800000;
                auVar140._24_4_ = 0xbf800000;
                auVar140._28_4_ = 0xbf800000;
                auVar31._8_4_ = 0x40000000;
                auVar31._0_8_ = 0x4000000040000000;
                auVar31._12_4_ = 0x40000000;
                auVar31._16_4_ = 0x40000000;
                auVar31._20_4_ = 0x40000000;
                auVar31._24_4_ = 0x40000000;
                auVar31._28_4_ = 0x40000000;
                local_3a0 = vfmadd132ps_avx512vl(local_260,auVar140,auVar31);
                local_260 = local_3a0;
                auVar103 = local_260;
                local_360 = (undefined4)lVar69;
                local_340 = local_5b0;
                uStack_338 = uStack_5a8;
                local_330 = local_5c0;
                uStack_328 = uStack_5b8;
                local_320 = local_560;
                uStack_318 = uStack_558;
                pGVar10 = (context->scene->geometries).items[local_668].ptr;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar64 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar64 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar104 = vaddps_avx512vl(local_500,_DAT_02020f40);
                  auVar79 = vcvtsi2ss_avx512f(local_c0._0_16_,local_360);
                  fVar160 = auVar79._0_4_;
                  local_300[0] = (fVar160 + auVar104._0_4_) * (float)local_2a0._0_4_;
                  local_300[1] = (fVar160 + auVar104._4_4_) * (float)local_2a0._4_4_;
                  local_300[2] = (fVar160 + auVar104._8_4_) * fStack_298;
                  local_300[3] = (fVar160 + auVar104._12_4_) * fStack_294;
                  fStack_2f0 = (fVar160 + auVar104._16_4_) * fStack_290;
                  fStack_2ec = (fVar160 + auVar104._20_4_) * fStack_28c;
                  fStack_2e8 = (fVar160 + auVar104._24_4_) * fStack_288;
                  fStack_2e4 = fVar160 + auVar104._28_4_;
                  local_260._0_8_ = local_3a0._0_8_;
                  local_260._8_8_ = local_3a0._8_8_;
                  local_260._16_8_ = local_3a0._16_8_;
                  local_260._24_8_ = local_3a0._24_8_;
                  local_2e0 = local_260._0_8_;
                  uStack_2d8 = local_260._8_8_;
                  uStack_2d0 = local_260._16_8_;
                  uStack_2c8 = local_260._24_8_;
                  local_2c0 = local_520;
                  local_630._8_8_ = uStack_5a8;
                  local_630._0_8_ = local_5b0;
                  uVar71 = 0;
                  uVar65 = (ulong)local_310;
                  for (uVar67 = uVar65; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000
                      ) {
                    uVar71 = uVar71 + 1;
                  }
                  local_200 = local_5c0;
                  uStack_1f8 = uStack_5b8;
                  local_210 = local_560;
                  uStack_208 = uStack_558;
                  local_620 = CONCAT44(local_620._4_4_,1);
                  local_3c0 = local_500;
                  local_380 = local_520;
                  local_35c = iVar9;
                  local_350 = auVar81;
                  local_260 = auVar103;
                  do {
                    local_610 = *(undefined4 *)(ray + k * 4 + 0x80);
                    fVar160 = local_300[uVar71];
                    local_420._4_4_ = fVar160;
                    local_420._0_4_ = fVar160;
                    local_420._8_4_ = fVar160;
                    local_420._12_4_ = fVar160;
                    local_410 = *(undefined4 *)((long)&local_2e0 + uVar71 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2c0 + uVar71 * 4);
                    local_660.context = context->user;
                    fVar167 = 1.0 - fVar160;
                    auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar160 * (fVar167 + fVar167))),
                                               ZEXT416((uint)fVar167),ZEXT416((uint)fVar167));
                    auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                              ZEXT416(0xc0a00000));
                    auVar74 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160 * 3.0)),
                                              ZEXT416((uint)(fVar160 + fVar160)),auVar79);
                    auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                              ZEXT416(0x40000000));
                    auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar167 * fVar167 * -3.0)),
                                              ZEXT416((uint)(fVar167 + fVar167)),auVar79);
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar160 * fVar160)),local_420,
                                              ZEXT416((uint)(fVar167 * -2.0)));
                    fVar160 = auVar19._0_4_ * 0.5;
                    fVar167 = auVar74._0_4_ * 0.5;
                    fVar168 = auVar79._0_4_ * 0.5;
                    fVar169 = auVar80._0_4_ * 0.5;
                    auVar156._0_4_ = fVar169 * (float)local_210;
                    auVar156._4_4_ = fVar169 * local_210._4_4_;
                    auVar156._8_4_ = fVar169 * (float)uStack_208;
                    auVar156._12_4_ = fVar169 * uStack_208._4_4_;
                    auVar172._4_4_ = fVar168;
                    auVar172._0_4_ = fVar168;
                    auVar172._8_4_ = fVar168;
                    auVar172._12_4_ = fVar168;
                    auVar62._8_8_ = uStack_1f8;
                    auVar62._0_8_ = local_200;
                    auVar79 = vfmadd132ps_fma(auVar172,auVar156,auVar62);
                    auVar157._4_4_ = fVar167;
                    auVar157._0_4_ = fVar167;
                    auVar157._8_4_ = fVar167;
                    auVar157._12_4_ = fVar167;
                    auVar79 = vfmadd132ps_fma(auVar157,auVar79,local_630);
                    auVar137._4_4_ = fVar160;
                    auVar137._0_4_ = fVar160;
                    auVar137._8_4_ = fVar160;
                    auVar137._12_4_ = fVar160;
                    auVar79 = vfmadd213ps_fma(auVar137,auVar81,auVar79);
                    local_450 = auVar79._0_4_;
                    local_440 = vshufps_avx(auVar79,auVar79,0x55);
                    local_430 = vshufps_avx(auVar79,auVar79,0xaa);
                    local_400 = local_5e0._0_8_;
                    uStack_3f8 = local_5e0._8_8_;
                    local_3f0 = local_5d0;
                    vpcmpeqd_avx2(ZEXT1632(local_5d0),ZEXT1632(local_5d0));
                    uStack_3dc = (local_660.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_660.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_680 = local_490._0_8_;
                    uStack_678 = local_490._8_8_;
                    local_660.valid = (int *)&local_680;
                    local_660.geometryUserPtr = pGVar10->userPtr;
                    local_660.hit = (RTCHitN *)&local_450;
                    local_660.N = 4;
                    pRVar63 = (RayK<4> *)pGVar10->occlusionFilterN;
                    local_5f0._0_8_ = uVar65;
                    local_600._0_8_ = uVar71;
                    uVar67 = uVar71;
                    local_660.ray = (RTCRayN *)ray;
                    uStack_44c = local_450;
                    uStack_448 = local_450;
                    uStack_444 = local_450;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    if (pRVar63 != (RayK<4> *)0x0) {
                      pRVar63 = (RayK<4> *)(*(code *)pRVar63)(&local_660);
                      uVar65 = local_5f0._0_8_;
                      uVar67 = local_600._0_8_;
                    }
                    auVar57._8_8_ = uStack_678;
                    auVar57._0_8_ = local_680;
                    uVar71 = vptestmd_avx512vl(auVar57,auVar57);
                    if ((uVar71 & 0xf) != 0) {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var11)(&local_660);
                        uVar65 = local_5f0._0_8_;
                        uVar67 = local_600._0_8_;
                      }
                      auVar80 = auVar196._0_16_;
                      auVar58._8_8_ = uStack_678;
                      auVar58._0_8_ = local_680;
                      auVar79 = *(undefined1 (*) [16])(local_660.ray + 0x80);
                      uVar71 = vptestmd_avx512vl(auVar58,auVar58);
                      uVar71 = uVar71 & 0xf;
                      auVar74 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar12 = (bool)((byte)uVar71 & 1);
                      auVar86._0_4_ = (uint)bVar12 * auVar74._0_4_ | (uint)!bVar12 * auVar79._0_4_;
                      bVar12 = (bool)((byte)(uVar71 >> 1) & 1);
                      auVar86._4_4_ = (uint)bVar12 * auVar74._4_4_ | (uint)!bVar12 * auVar79._4_4_;
                      bVar12 = (bool)((byte)(uVar71 >> 2) & 1);
                      auVar86._8_4_ = (uint)bVar12 * auVar74._8_4_ | (uint)!bVar12 * auVar79._8_4_;
                      bVar12 = SUB81(uVar71 >> 3,0);
                      auVar86._12_4_ =
                           (uint)bVar12 * auVar74._12_4_ | (uint)!bVar12 * auVar79._12_4_;
                      *(undefined1 (*) [16])(local_660.ray + 0x80) = auVar86;
                      pRVar63 = (RayK<4> *)local_660.ray;
                      if ((byte)uVar71 != 0) break;
                    }
                    auVar80 = auVar196._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_610;
                    uVar71 = 0;
                    uVar65 = uVar65 ^ 1L << (uVar67 & 0x3f);
                    for (uVar67 = uVar65; (uVar67 & 1) == 0;
                        uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                      uVar71 = uVar71 + 1;
                    }
                    local_620 = CONCAT44(local_620._4_4_,
                                         (int)CONCAT71((int7)((ulong)pRVar63 >> 8),uVar65 != 0));
                  } while (uVar65 != 0);
                  bVar64 = (byte)local_620 & 1;
                  auVar79 = vxorps_avx512vl(auVar80,auVar80);
                  auVar196 = ZEXT1664(auVar79);
                  in_ZMM20 = ZEXT3264(local_500);
                  auVar194 = ZEXT3264(local_520);
                  auVar195 = ZEXT3264(local_4c0);
                  auVar193 = ZEXT3264(local_580);
                  auVar192 = ZEXT3264(local_5a0);
                }
                bVar66 = (bool)(bVar66 | bVar64);
              }
            }
          }
          auVar177 = ZEXT3264(auVar146);
          auVar147 = ZEXT3264(auVar114);
          local_520 = auVar194._0_32_;
          lVar69 = lVar69 + 8;
        } while ((int)lVar69 < iVar9);
      }
      if (bVar66 != false) {
        return local_6f9;
      }
      uVar133 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar24._4_4_ = uVar133;
      auVar24._0_4_ = uVar133;
      auVar24._8_4_ = uVar133;
      auVar24._12_4_ = uVar133;
      uVar141 = vcmpps_avx512vl(local_1f0,auVar24,2);
      uVar68 = (uint)uVar70 & (uint)uVar141;
      uVar70 = (ulong)uVar68;
      local_6f9 = uVar68 != 0;
    } while (local_6f9);
  }
  return local_6f9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }